

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 *puVar1;
  BBox1f BVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  long lVar7;
  long lVar8;
  RTCRayQueryContext *pRVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar13;
  size_t k;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *paVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  int iVar55;
  AABBNodeMB4D *node1;
  ulong uVar56;
  ulong uVar57;
  uint uVar58;
  long lVar59;
  undefined1 (*pauVar60) [32];
  ulong uVar61;
  ulong uVar62;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *paVar63;
  ulong *puVar64;
  NodeRef root;
  undefined4 uVar65;
  ulong unaff_R15;
  bool bVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  float fVar75;
  float fVar76;
  undefined1 auVar74 [64];
  float fVar77;
  float fVar87;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 in_ZMM1 [64];
  undefined1 auVar86 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar101 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  float fVar106;
  float fVar107;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  float fVar124;
  float fVar125;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar133 [64];
  float fVar147;
  float fVar160;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar158;
  float fVar159;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar157 [64];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar164;
  float fVar175;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar173;
  float fVar174;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar172 [64];
  float fVar179;
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar189;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar187;
  float fVar188;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar186 [64];
  undefined1 auVar193 [28];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar196 [28];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  uint uVar202;
  undefined1 auVar203 [32];
  uint uVar205;
  uint uVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar204 [64];
  float fVar209;
  undefined1 auVar210 [32];
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 in_ZMM12 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [28];
  undefined1 in_ZMM13 [64];
  float fVar220;
  undefined1 auVar221 [32];
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 in_ZMM14 [64];
  float fVar228;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar229 [64];
  vuint<4> *v;
  Precalculations pre;
  QuadMesh *mesh;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  vbool<8> terminated;
  Vec3<embree::vfloat_impl<8>_> p0;
  TravRayK<8,_false> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2d51;
  Geometry *local_2d50;
  ulong local_2d48;
  undefined1 local_2d40 [32];
  undefined1 local_2d20 [48];
  RayK<8> *local_2cf0;
  int local_2ce4;
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [32];
  undefined8 local_2ca0;
  float fStack_2c98;
  float fStack_2c94;
  float fStack_2c90;
  float fStack_2c8c;
  float fStack_2c88;
  float local_2c80 [4];
  float fStack_2c70;
  float fStack_2c6c;
  float fStack_2c68;
  undefined1 local_2c60 [56];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *local_2c28;
  undefined1 local_2c20 [8];
  undefined8 uStack_2c18;
  float fStack_2c10;
  float fStack_2c0c;
  float fStack_2c08;
  float fStack_2c04;
  undefined1 local_2c00 [8];
  float fStack_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float fStack_2be8;
  float fStack_2be4;
  BVH *local_2bd0;
  Intersectors *local_2bc8;
  ulong local_2bc0;
  ulong local_2bb8;
  ulong local_2bb0;
  ulong local_2ba8;
  undefined1 local_2ba0 [8];
  float fStack_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  float fStack_2b88;
  float fStack_2b84;
  undefined1 local_2b80 [8];
  undefined8 uStack_2b78;
  float fStack_2b70;
  float fStack_2b6c;
  float fStack_2b68;
  float fStack_2b64;
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [8];
  float fStack_2b18;
  float fStack_2b14;
  float fStack_2b10;
  float fStack_2b0c;
  float fStack_2b08;
  float fStack_2b04;
  undefined1 local_2b00 [8];
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined1 local_2aa0 [8];
  float fStack_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  float fStack_2a88;
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2a00;
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2840;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined4 uStack_2704;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  undefined4 uStack_26e4;
  float local_26e0;
  float fStack_26dc;
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  undefined4 uStack_26c4;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *tray_00;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar201 [64];
  undefined1 auVar219 [32];
  
  local_2608 = (((BVH *)This->ptr)->root).ptr;
  if (local_2608 != 8) {
    auVar104 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar93 = ZEXT816(0) << 0x40;
    auVar95 = vpcmpeqd_avx2(auVar104,(undefined1  [32])valid_i->field_0);
    auVar104 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar93),5);
    auVar94 = auVar95 & auVar104;
    if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar94 >> 0x7f,0) != '\0') ||
          (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar94 >> 0xbf,0) != '\0') ||
        (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar94[0x1f] < '\0')
    {
      auVar104 = vandps_avx(auVar104,auVar95);
      auVar68 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
      local_2840._0_4_ = *(float *)ray;
      local_2840._4_4_ = *(float *)(ray + 4);
      local_2840._8_4_ = *(float *)(ray + 8);
      local_2840._12_4_ = *(float *)(ray + 0xc);
      local_2840._16_4_ = *(float *)(ray + 0x10);
      local_2840._20_4_ = *(float *)(ray + 0x14);
      local_2840._24_4_ = *(float *)(ray + 0x18);
      local_2840._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_2840._32_4_ = *(float *)(ray + 0x20);
      local_2840._36_4_ = *(float *)(ray + 0x24);
      local_2840._40_4_ = *(float *)(ray + 0x28);
      local_2840._44_4_ = *(float *)(ray + 0x2c);
      local_2840._48_4_ = *(float *)(ray + 0x30);
      local_2840._52_4_ = *(float *)(ray + 0x34);
      local_2840._56_4_ = *(float *)(ray + 0x38);
      local_2840._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_2840._64_4_ = *(float *)(ray + 0x40);
      local_2840._68_4_ = *(float *)(ray + 0x44);
      local_2840._72_4_ = *(float *)(ray + 0x48);
      local_2840._76_4_ = *(float *)(ray + 0x4c);
      local_2840._80_4_ = *(float *)(ray + 0x50);
      local_2840._84_4_ = *(float *)(ray + 0x54);
      local_2840._88_4_ = *(float *)(ray + 0x58);
      local_2840._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_27e0 = *(undefined1 (*) [32])(ray + 0x80);
      local_27c0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_27a0 = *(undefined1 (*) [32])(ray + 0xc0);
      local_2a00._72_4_ = 0x7fffffff;
      local_2a00._64_8_ = 0x7fffffff7fffffff;
      local_2a00._76_4_ = 0x7fffffff;
      local_2a00._80_4_ = 0x7fffffff;
      local_2a00._84_4_ = 0x7fffffff;
      local_2a00._88_4_ = 0x7fffffff;
      local_2a00._92_4_ = 0x7fffffff;
      auVar204 = ZEXT3264((undefined1  [32])local_2a00.field_0.z.field_0);
      auVar197._8_4_ = 0x219392ef;
      auVar197._0_8_ = 0x219392ef219392ef;
      auVar197._12_4_ = 0x219392ef;
      auVar197._16_4_ = 0x219392ef;
      auVar197._20_4_ = 0x219392ef;
      auVar197._24_4_ = 0x219392ef;
      auVar197._28_4_ = 0x219392ef;
      auVar104 = vandps_avx((undefined1  [32])local_2a00.field_0.z.field_0,local_27e0);
      auVar104 = vcmpps_avx(auVar104,auVar197,1);
      auVar94 = vblendvps_avx(local_27e0,auVar197,auVar104);
      auVar104 = vandps_avx((undefined1  [32])local_2a00.field_0.z.field_0,local_27c0);
      auVar104 = vcmpps_avx(auVar104,auVar197,1);
      auVar95 = vblendvps_avx(local_27c0,auVar197,auVar104);
      auVar104 = vandps_avx(local_27a0,(undefined1  [32])local_2a00.field_0.z.field_0);
      auVar104 = vcmpps_avx(auVar104,auVar197,1);
      auVar104 = vblendvps_avx(local_27a0,auVar197,auVar104);
      auVar101 = vrcpps_avx(auVar94);
      auVar198._8_4_ = 0x3f800000;
      auVar198._0_8_ = 0x3f8000003f800000;
      auVar198._12_4_ = 0x3f800000;
      auVar198._16_4_ = 0x3f800000;
      auVar198._20_4_ = 0x3f800000;
      auVar198._24_4_ = 0x3f800000;
      auVar198._28_4_ = 0x3f800000;
      auVar201 = ZEXT3264(auVar198);
      auVar15 = vfnmadd213ps_fma(auVar94,auVar101,auVar198);
      auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar101,auVar101);
      auVar186 = ZEXT1664(auVar15);
      auVar94 = vrcpps_avx(auVar95);
      auVar16 = vfnmadd213ps_fma(auVar95,auVar94,auVar198);
      auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar94,auVar94);
      auVar172 = ZEXT1664(auVar16);
      auVar94 = vrcpps_avx(auVar104);
      auVar195 = ZEXT3264(auVar94);
      auVar17 = vfnmadd213ps_fma(auVar104,auVar94,auVar198);
      auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar94,auVar94);
      auVar157 = ZEXT1664(auVar17);
      local_2780 = ZEXT1632(auVar15);
      local_2760 = ZEXT1632(auVar16);
      local_2740 = ZEXT1632(auVar17);
      local_2720 = auVar15._0_4_ * *(float *)ray;
      fStack_271c = auVar15._4_4_ * *(float *)(ray + 4);
      fStack_2718 = auVar15._8_4_ * *(float *)(ray + 8);
      fStack_2714 = auVar15._12_4_ * *(float *)(ray + 0xc);
      fStack_2710 = *(float *)(ray + 0x10) * 0.0;
      fStack_270c = *(float *)(ray + 0x14) * 0.0;
      fStack_2708 = *(float *)(ray + 0x18) * 0.0;
      uStack_2704 = *(undefined4 *)(ray + 0x1c);
      local_2700 = *(float *)(ray + 0x20) * auVar16._0_4_;
      fStack_26fc = *(float *)(ray + 0x24) * auVar16._4_4_;
      fStack_26f8 = *(float *)(ray + 0x28) * auVar16._8_4_;
      fStack_26f4 = *(float *)(ray + 0x2c) * auVar16._12_4_;
      fStack_26f0 = *(float *)(ray + 0x30) * 0.0;
      fStack_26ec = *(float *)(ray + 0x34) * 0.0;
      fStack_26e8 = *(float *)(ray + 0x38) * 0.0;
      uStack_26e4 = *(undefined4 *)(ray + 0x3c);
      local_26e0 = *(float *)(ray + 0x40) * auVar17._0_4_;
      fStack_26dc = *(float *)(ray + 0x44) * auVar17._4_4_;
      fStack_26d8 = *(float *)(ray + 0x48) * auVar17._8_4_;
      fStack_26d4 = *(float *)(ray + 0x4c) * auVar17._12_4_;
      fStack_26d0 = *(float *)(ray + 0x50) * 0.0;
      fStack_26cc = *(float *)(ray + 0x54) * 0.0;
      fStack_26c8 = *(float *)(ray + 0x58) * 0.0;
      uStack_26c4 = *(undefined4 *)(ray + 0x5c);
      auVar104 = vcmpps_avx(ZEXT1632(auVar15),ZEXT1632(auVar93),1);
      auVar94._8_4_ = 0x10;
      auVar94._0_8_ = 0x1000000010;
      auVar94._12_4_ = 0x10;
      auVar94._16_4_ = 0x10;
      auVar94._20_4_ = 0x10;
      auVar94._24_4_ = 0x10;
      auVar94._28_4_ = 0x10;
      local_26c0 = vandps_avx(auVar104,auVar94);
      auVar95._8_4_ = 0x20;
      auVar95._0_8_ = 0x2000000020;
      auVar95._12_4_ = 0x20;
      auVar95._16_4_ = 0x20;
      auVar95._20_4_ = 0x20;
      auVar95._24_4_ = 0x20;
      auVar95._28_4_ = 0x20;
      auVar108._8_4_ = 0x30;
      auVar108._0_8_ = 0x3000000030;
      auVar108._12_4_ = 0x30;
      auVar108._16_4_ = 0x30;
      auVar108._20_4_ = 0x30;
      auVar108._24_4_ = 0x30;
      auVar108._28_4_ = 0x30;
      auVar94 = ZEXT1632(auVar93);
      auVar104 = vcmpps_avx(ZEXT1632(auVar16),auVar94,5);
      local_26a0 = vblendvps_avx(auVar108,auVar95,auVar104);
      auVar101._8_4_ = 0x40;
      auVar101._0_8_ = 0x4000000040;
      auVar101._12_4_ = 0x40;
      auVar101._16_4_ = 0x40;
      auVar101._20_4_ = 0x40;
      auVar101._24_4_ = 0x40;
      auVar101._28_4_ = 0x40;
      auVar109._8_4_ = 0x50;
      auVar109._0_8_ = 0x5000000050;
      auVar109._12_4_ = 0x50;
      auVar109._16_4_ = 0x50;
      auVar109._20_4_ = 0x50;
      auVar109._24_4_ = 0x50;
      auVar109._28_4_ = 0x50;
      auVar104 = vcmpps_avx(ZEXT1632(auVar17),auVar94,5);
      auVar133 = ZEXT3264(auVar104);
      local_2680 = vblendvps_avx(auVar109,auVar101,auVar104);
      auVar104 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar94);
      auVar94 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar94);
      local_28c0 = vpmovsxwd_avx2(auVar68);
      auVar114 = ZEXT3264(local_28c0);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar229 = ZEXT3264(local_1e80);
      local_2660 = vblendvps_avx(local_1e80,auVar104,local_28c0);
      auVar104._8_4_ = 0xff800000;
      auVar104._0_8_ = 0xff800000ff800000;
      auVar104._12_4_ = 0xff800000;
      auVar104._16_4_ = 0xff800000;
      auVar104._20_4_ = 0xff800000;
      auVar104._24_4_ = 0xff800000;
      auVar104._28_4_ = 0xff800000;
      local_2640 = vblendvps_avx(auVar104,auVar94,local_28c0);
      auVar93 = vpcmpeqd_avx(local_2640._0_16_,local_2640._0_16_);
      local_2b60 = vpmovsxwd_avx2(auVar68 ^ auVar93);
      local_2bc8 = This;
      local_2bd0 = (BVH *)This->ptr;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar62 = 5;
      }
      else {
        uVar62 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2cf0 = ray + 0x100;
      puVar64 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar60 = (undefined1 (*) [32])local_1e40;
      local_1e60 = local_2660;
      local_28e0 = mm_lookupmask_ps._16_8_;
      uStack_28d8 = mm_lookupmask_ps._24_8_;
      uStack_28d0 = mm_lookupmask_ps._16_8_;
      uStack_28c8 = mm_lookupmask_ps._24_8_;
      tray_00 = &local_2a00;
      local_2c28 = tray_00;
      local_2900 = mm_lookupmask_pd._0_8_;
      uStack_28f8 = mm_lookupmask_pd._8_8_;
      uStack_28f0 = mm_lookupmask_pd._0_8_;
      uStack_28e8 = mm_lookupmask_pd._8_8_;
      auVar104 = vpcmpeqd_avx2(local_2b60,local_2b60);
      auVar86 = ZEXT3264(auVar104);
LAB_00546fdd:
      do {
        do {
          root.ptr = puVar64[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_005485af;
          puVar64 = puVar64 + -1;
          pauVar60 = pauVar60 + -1;
          local_2d40 = *pauVar60;
          auVar105 = ZEXT3264(local_2d40);
          auVar104 = vcmpps_avx(local_2d40,local_2640,1);
        } while ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar104 >> 0x7f,0) == '\0') &&
                   (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar104 >> 0xbf,0) == '\0') &&
                 (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar104[0x1f]);
        uVar65 = vmovmskps_avx(auVar104);
        unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar65);
        if (uVar62 < CONCAT44(0,POPCOUNT(uVar65))) {
LAB_0054701b:
          do {
            lVar59 = -0x10;
            uVar57 = 8;
            auVar104 = auVar86._0_32_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_005485af;
              auVar94 = vcmpps_avx(local_2640,auVar105._0_32_,6);
              if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar94 >> 0x7f,0) != '\0') ||
                    (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar94 >> 0xbf,0) != '\0') ||
                  (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar94[0x1f] < '\0') {
                auVar105 = ZEXT3264(local_2b60);
                local_2bc0 = (ulong)((uint)root.ptr & 0xf) - 8;
                auVar94 = local_2b60;
                if (local_2bc0 != 0) {
                  auVar103._0_4_ = local_2b60._0_4_ ^ auVar86._0_4_;
                  auVar103._4_4_ = local_2b60._4_4_ ^ auVar86._4_4_;
                  auVar103._8_4_ = local_2b60._8_4_ ^ auVar86._8_4_;
                  auVar103._12_4_ = local_2b60._12_4_ ^ auVar86._12_4_;
                  auVar103._16_4_ = local_2b60._16_4_ ^ auVar86._16_4_;
                  auVar103._20_4_ = local_2b60._20_4_ ^ auVar86._20_4_;
                  auVar103._24_4_ = local_2b60._24_4_ ^ auVar86._24_4_;
                  auVar103._28_4_ = local_2b60._28_4_ ^ auVar86._28_4_;
                  uVar57 = 0;
                  local_2940 = local_2b60;
                  do {
                    local_2bb8 = uVar57;
                    lVar59 = uVar57 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                    uVar58 = vmovmskps_avx(auVar103);
                    tray_00 = (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *)
                              CONCAT44((int)((ulong)tray_00 >> 0x20),uVar58);
                    uVar202 = 0;
                    for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x80000000) {
                      uVar202 = uVar202 + 1;
                    }
                    local_2ba8 = (ulong)uVar202;
                    local_2d48 = 0;
                    for (paVar63 = tray_00; ((ulong)paVar63 & 1) == 0;
                        paVar63 = (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *)
                                  ((ulong)paVar63 >> 1 | 0x8000000000000000)) {
                      local_2d48 = local_2d48 + 1;
                    }
                    auVar74 = ZEXT3264(auVar103);
                    local_2920 = auVar103;
                    uVar57 = 0;
                    while( true ) {
                      fVar207 = auVar157._28_4_;
                      auVar196 = auVar201._0_28_;
                      auVar203 = auVar204._0_32_;
                      auVar95 = auVar74._0_32_;
                      auVar193 = auVar195._0_28_;
                      auVar218 = in_ZMM13._0_28_;
                      iVar55 = *(int *)(lVar59 + 0x50 + uVar57 * 4);
                      unaff_R15 = uVar57;
                      if (iVar55 == -1) break;
                      local_2bb0 = (ulong)*(uint *)(lVar59 + 0x40 + uVar57 * 4);
                      local_2d50 = (context->scene->geometries).items[local_2bb0].ptr;
                      BVar2 = local_2d50->time_range;
                      auVar68._8_8_ = 0;
                      auVar68._0_4_ = BVar2.lower;
                      auVar68._4_4_ = BVar2.upper;
                      fVar67 = BVar2.lower;
                      auVar78._4_4_ = fVar67;
                      auVar78._0_4_ = fVar67;
                      auVar78._8_4_ = fVar67;
                      auVar78._12_4_ = fVar67;
                      auVar78._16_4_ = fVar67;
                      auVar78._20_4_ = fVar67;
                      auVar78._24_4_ = fVar67;
                      auVar78._28_4_ = fVar67;
                      auVar104 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar78);
                      auVar93 = vmovshdup_avx(auVar68);
                      auVar93 = vsubps_avx(auVar93,auVar68);
                      auVar69._0_4_ = auVar93._0_4_;
                      auVar69._4_4_ = auVar69._0_4_;
                      auVar69._8_4_ = auVar69._0_4_;
                      auVar69._12_4_ = auVar69._0_4_;
                      auVar69._16_4_ = auVar69._0_4_;
                      auVar69._20_4_ = auVar69._0_4_;
                      auVar69._24_4_ = auVar69._0_4_;
                      auVar69._28_4_ = auVar69._0_4_;
                      auVar104 = vdivps_avx(auVar104,auVar69);
                      fVar67 = local_2d50->fnumTimeSegments;
                      auVar18._4_4_ = fVar67 * auVar104._4_4_;
                      auVar18._0_4_ = fVar67 * auVar104._0_4_;
                      auVar18._8_4_ = fVar67 * auVar104._8_4_;
                      auVar18._12_4_ = fVar67 * auVar104._12_4_;
                      auVar18._16_4_ = fVar67 * auVar104._16_4_;
                      auVar18._20_4_ = fVar67 * auVar104._20_4_;
                      auVar18._24_4_ = fVar67 * auVar104._24_4_;
                      auVar18._28_4_ = auVar104._28_4_;
                      auVar104 = vroundps_avx(auVar18,1);
                      fVar67 = fVar67 + -1.0;
                      auVar79._4_4_ = fVar67;
                      auVar79._0_4_ = fVar67;
                      auVar79._8_4_ = fVar67;
                      auVar79._12_4_ = fVar67;
                      auVar79._16_4_ = fVar67;
                      auVar79._20_4_ = fVar67;
                      auVar79._24_4_ = fVar67;
                      auVar79._28_4_ = fVar67;
                      auVar104 = vminps_avx(auVar104,auVar79);
                      auVar104 = vmaxps_avx(auVar104,_DAT_01faff00);
                      auVar94 = vsubps_avx(auVar18,auVar104);
                      local_2ce0 = vcvtps2dq_avx(auVar104);
                      iVar3 = *(int *)(local_2ce0 + local_2ba8 * 4);
                      auVar96._4_4_ = iVar3;
                      auVar96._0_4_ = iVar3;
                      auVar96._8_4_ = iVar3;
                      auVar96._12_4_ = iVar3;
                      auVar96._16_4_ = iVar3;
                      auVar96._20_4_ = iVar3;
                      auVar96._24_4_ = iVar3;
                      auVar96._28_4_ = iVar3;
                      auVar104 = vpcmpeqd_avx2(auVar96,local_2ce0);
                      auVar104 = local_2920 & ~auVar104;
                      fVar107 = auVar94._4_4_;
                      fVar116 = auVar94._8_4_;
                      fVar118 = auVar94._12_4_;
                      fVar120 = auVar94._16_4_;
                      fVar75 = auVar94._20_4_;
                      fVar76 = auVar94._24_4_;
                      fVar208 = auVar94._0_4_;
                      fVar67 = local_2920._28_4_;
                      auVar157._28_36_ = auVar229._28_36_;
                      if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar104 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar104 >> 0x7f,0) == '\0') &&
                            (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar104 >> 0xbf,0) == '\0') &&
                          (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar104[0x1f]) {
                        lVar7 = *(long *)(*(long *)&local_2d50[2].numPrimitives + (long)iVar3 * 0x38
                                         );
                        lVar8 = *(long *)(*(long *)&local_2d50[2].numPrimitives + 0x38 +
                                         (long)iVar3 * 0x38);
                        uVar56 = (ulong)*(uint *)(lVar59 + uVar57 * 4);
                        uVar65 = *(undefined4 *)(lVar7 + uVar56 * 4);
                        auVar127._4_4_ = uVar65;
                        auVar127._0_4_ = uVar65;
                        auVar127._8_4_ = uVar65;
                        auVar127._12_4_ = uVar65;
                        auVar127._16_4_ = uVar65;
                        auVar127._20_4_ = uVar65;
                        auVar127._24_4_ = uVar65;
                        auVar127._28_4_ = uVar65;
                        uVar65 = *(undefined4 *)(lVar7 + 4 + uVar56 * 4);
                        auVar152._4_4_ = uVar65;
                        auVar152._0_4_ = uVar65;
                        auVar152._8_4_ = uVar65;
                        auVar152._12_4_ = uVar65;
                        auVar152._16_4_ = uVar65;
                        auVar152._20_4_ = uVar65;
                        auVar152._24_4_ = uVar65;
                        auVar152._28_4_ = uVar65;
                        uVar65 = *(undefined4 *)(lVar7 + 8 + uVar56 * 4);
                        auVar168._4_4_ = uVar65;
                        auVar168._0_4_ = uVar65;
                        auVar168._8_4_ = uVar65;
                        auVar168._12_4_ = uVar65;
                        auVar168._16_4_ = uVar65;
                        auVar168._20_4_ = uVar65;
                        auVar168._24_4_ = uVar65;
                        auVar168._28_4_ = uVar65;
                        fVar207 = *(float *)(lVar8 + uVar56 * 4);
                        fVar67 = *(float *)(lVar8 + 4 + uVar56 * 4);
                        fVar146 = *(float *)(lVar8 + 8 + uVar56 * 4);
                        uVar56 = (ulong)*(uint *)(lVar59 + 0x10 + uVar57 * 4);
                        auVar80._8_4_ = 0x3f800000;
                        auVar80._0_8_ = 0x3f8000003f800000;
                        auVar80._12_4_ = 0x3f800000;
                        auVar80._16_4_ = 0x3f800000;
                        auVar80._20_4_ = 0x3f800000;
                        auVar80._24_4_ = 0x3f800000;
                        auVar80._28_4_ = 0x3f800000;
                        auVar104 = vsubps_avx(auVar80,auVar94);
                        auVar19._4_4_ = fVar107 * fVar207;
                        auVar19._0_4_ = fVar208 * fVar207;
                        auVar19._8_4_ = fVar116 * fVar207;
                        auVar19._12_4_ = fVar118 * fVar207;
                        auVar19._16_4_ = fVar120 * fVar207;
                        auVar19._20_4_ = fVar75 * fVar207;
                        auVar19._24_4_ = fVar76 * fVar207;
                        auVar19._28_4_ = fVar207;
                        auVar20._4_4_ = fVar107 * fVar67;
                        auVar20._0_4_ = fVar208 * fVar67;
                        auVar20._8_4_ = fVar116 * fVar67;
                        auVar20._12_4_ = fVar118 * fVar67;
                        auVar20._16_4_ = fVar120 * fVar67;
                        auVar20._20_4_ = fVar75 * fVar67;
                        auVar20._24_4_ = fVar76 * fVar67;
                        auVar20._28_4_ = fVar67;
                        auVar21._4_4_ = fVar107 * fVar146;
                        auVar21._0_4_ = fVar208 * fVar146;
                        auVar21._8_4_ = fVar116 * fVar146;
                        auVar21._12_4_ = fVar118 * fVar146;
                        auVar21._16_4_ = fVar120 * fVar146;
                        auVar21._20_4_ = fVar75 * fVar146;
                        auVar21._24_4_ = fVar76 * fVar146;
                        auVar21._28_4_ = fVar146;
                        auVar93 = vfmadd231ps_fma(auVar19,auVar104,auVar127);
                        auVar98 = ZEXT1632(auVar93);
                        auVar93 = vfmadd231ps_fma(auVar20,auVar104,auVar152);
                        auVar229 = ZEXT1664(auVar93);
                        auVar93 = vfmadd231ps_fma(auVar21,auVar104,auVar168);
                        auVar113 = ZEXT1632(auVar93);
                        uVar65 = *(undefined4 *)(lVar7 + uVar56 * 4);
                        auVar128._4_4_ = uVar65;
                        auVar128._0_4_ = uVar65;
                        auVar128._8_4_ = uVar65;
                        auVar128._12_4_ = uVar65;
                        auVar128._16_4_ = uVar65;
                        auVar128._20_4_ = uVar65;
                        auVar128._24_4_ = uVar65;
                        auVar128._28_4_ = uVar65;
                        uVar65 = *(undefined4 *)(lVar7 + 4 + uVar56 * 4);
                        auVar153._4_4_ = uVar65;
                        auVar153._0_4_ = uVar65;
                        auVar153._8_4_ = uVar65;
                        auVar153._12_4_ = uVar65;
                        auVar153._16_4_ = uVar65;
                        auVar153._20_4_ = uVar65;
                        auVar153._24_4_ = uVar65;
                        auVar153._28_4_ = uVar65;
                        uVar65 = *(undefined4 *)(lVar7 + 8 + uVar56 * 4);
                        auVar169._4_4_ = uVar65;
                        auVar169._0_4_ = uVar65;
                        auVar169._8_4_ = uVar65;
                        auVar169._12_4_ = uVar65;
                        auVar169._16_4_ = uVar65;
                        auVar169._20_4_ = uVar65;
                        auVar169._24_4_ = uVar65;
                        auVar169._28_4_ = uVar65;
                        fVar207 = *(float *)(lVar8 + uVar56 * 4);
                        fVar67 = *(float *)(lVar8 + 4 + uVar56 * 4);
                        fVar146 = *(float *)(lVar8 + 8 + uVar56 * 4);
                        auVar133._0_4_ = fVar207 * fVar208;
                        auVar133._4_4_ = fVar207 * fVar107;
                        auVar133._8_4_ = fVar207 * fVar116;
                        auVar133._12_4_ = fVar207 * fVar118;
                        auVar133._16_4_ = fVar207 * fVar120;
                        auVar133._20_4_ = fVar207 * fVar75;
                        auVar133._28_36_ = in_ZMM13._28_36_;
                        auVar133._24_4_ = fVar207 * fVar76;
                        auVar157._0_4_ = fVar67 * fVar208;
                        auVar157._4_4_ = fVar67 * fVar107;
                        auVar157._8_4_ = fVar67 * fVar116;
                        auVar157._12_4_ = fVar67 * fVar118;
                        auVar157._16_4_ = fVar67 * fVar120;
                        auVar157._20_4_ = fVar67 * fVar75;
                        auVar157._24_4_ = fVar67 * fVar76;
                        auVar114._0_4_ = fVar146 * fVar208;
                        auVar114._4_4_ = fVar146 * fVar107;
                        auVar114._8_4_ = fVar146 * fVar116;
                        auVar114._12_4_ = fVar146 * fVar118;
                        auVar114._16_4_ = fVar146 * fVar120;
                        auVar114._20_4_ = fVar146 * fVar75;
                        auVar114._28_36_ = auVar204._28_36_;
                        auVar114._24_4_ = fVar146 * fVar76;
                        auVar93 = vfmadd231ps_fma(auVar133._0_32_,auVar104,auVar128);
                        auVar210 = ZEXT1632(auVar93);
                        auVar93 = vfmadd231ps_fma(auVar157._0_32_,auVar104,auVar153);
                        auVar86 = ZEXT1664(auVar93);
                        uVar56 = (ulong)*(uint *)(lVar59 + 0x20 + uVar57 * 4);
                        uVar65 = *(undefined4 *)(lVar7 + uVar56 * 4);
                        auVar129._4_4_ = uVar65;
                        auVar129._0_4_ = uVar65;
                        auVar129._8_4_ = uVar65;
                        auVar129._12_4_ = uVar65;
                        auVar129._16_4_ = uVar65;
                        auVar129._20_4_ = uVar65;
                        auVar129._24_4_ = uVar65;
                        auVar129._28_4_ = uVar65;
                        uVar65 = *(undefined4 *)(lVar7 + 4 + uVar56 * 4);
                        auVar154._4_4_ = uVar65;
                        auVar154._0_4_ = uVar65;
                        auVar154._8_4_ = uVar65;
                        auVar154._12_4_ = uVar65;
                        auVar154._16_4_ = uVar65;
                        auVar154._20_4_ = uVar65;
                        auVar154._24_4_ = uVar65;
                        auVar154._28_4_ = uVar65;
                        uVar65 = *(undefined4 *)(lVar7 + 8 + uVar56 * 4);
                        auVar183._4_4_ = uVar65;
                        auVar183._0_4_ = uVar65;
                        auVar183._8_4_ = uVar65;
                        auVar183._12_4_ = uVar65;
                        auVar183._16_4_ = uVar65;
                        auVar183._20_4_ = uVar65;
                        auVar183._24_4_ = uVar65;
                        auVar183._28_4_ = uVar65;
                        fVar207 = *(float *)(lVar8 + uVar56 * 4);
                        fVar67 = *(float *)(lVar8 + 4 + uVar56 * 4);
                        auVar93 = vfmadd231ps_fma(auVar114._0_32_,auVar104,auVar169);
                        auVar221 = ZEXT1632(auVar93);
                        fVar146 = *(float *)(lVar8 + 8 + uVar56 * 4);
                        auVar22._4_4_ = fVar207 * fVar107;
                        auVar22._0_4_ = fVar207 * fVar208;
                        auVar22._8_4_ = fVar207 * fVar116;
                        auVar22._12_4_ = fVar207 * fVar118;
                        auVar22._16_4_ = fVar207 * fVar120;
                        auVar22._20_4_ = fVar207 * fVar75;
                        auVar22._24_4_ = fVar207 * fVar76;
                        auVar22._28_4_ = fVar207;
                        auVar23._4_4_ = fVar67 * fVar107;
                        auVar23._0_4_ = fVar67 * fVar208;
                        auVar23._8_4_ = fVar67 * fVar116;
                        auVar23._12_4_ = fVar67 * fVar118;
                        auVar23._16_4_ = fVar67 * fVar120;
                        auVar23._20_4_ = fVar67 * fVar75;
                        auVar23._24_4_ = fVar67 * fVar76;
                        auVar23._28_4_ = fVar67;
                        auVar24._4_4_ = fVar107 * fVar146;
                        auVar24._0_4_ = fVar208 * fVar146;
                        auVar24._8_4_ = fVar116 * fVar146;
                        auVar24._12_4_ = fVar118 * fVar146;
                        auVar24._16_4_ = fVar120 * fVar146;
                        auVar24._20_4_ = fVar75 * fVar146;
                        auVar24._24_4_ = fVar76 * fVar146;
                        auVar24._28_4_ = fVar146;
                        auVar93 = vfmadd231ps_fma(auVar22,auVar104,auVar129);
                        _local_2c00 = ZEXT1632(auVar93);
                        auVar93 = vfmadd231ps_fma(auVar23,auVar104,auVar154);
                        _local_2b00 = ZEXT1632(auVar93);
                        auVar93 = vfmadd231ps_fma(auVar24,auVar104,auVar183);
                        _local_2b20 = ZEXT1632(auVar93);
                        uVar56 = (ulong)*(uint *)(lVar59 + 0x30 + uVar57 * 4);
                        uVar65 = *(undefined4 *)(lVar7 + uVar56 * 4);
                        auVar130._4_4_ = uVar65;
                        auVar130._0_4_ = uVar65;
                        auVar130._8_4_ = uVar65;
                        auVar130._12_4_ = uVar65;
                        auVar130._16_4_ = uVar65;
                        auVar130._20_4_ = uVar65;
                        auVar130._24_4_ = uVar65;
                        auVar130._28_4_ = uVar65;
                        fVar207 = *(float *)(lVar8 + uVar56 * 4);
                        fVar67 = *(float *)(lVar8 + 4 + uVar56 * 4);
                        fVar146 = *(float *)(lVar8 + 8 + uVar56 * 4);
                        auVar200._0_4_ = fVar208 * fVar207;
                        auVar200._4_4_ = fVar107 * fVar207;
                        auVar200._8_4_ = fVar116 * fVar207;
                        auVar200._12_4_ = fVar118 * fVar207;
                        auVar200._16_4_ = fVar120 * fVar207;
                        auVar200._20_4_ = fVar75 * fVar207;
                        auVar200._24_4_ = fVar76 * fVar207;
                        auVar200._28_4_ = 0;
                        auVar25._4_4_ = fVar107 * fVar67;
                        auVar25._0_4_ = fVar208 * fVar67;
                        auVar25._8_4_ = fVar116 * fVar67;
                        auVar25._12_4_ = fVar118 * fVar67;
                        auVar25._16_4_ = fVar120 * fVar67;
                        auVar25._20_4_ = fVar75 * fVar67;
                        auVar25._24_4_ = fVar76 * fVar67;
                        auVar25._28_4_ = fVar207;
                        auVar26._4_4_ = fVar146 * fVar107;
                        auVar26._0_4_ = fVar146 * fVar208;
                        auVar26._8_4_ = fVar146 * fVar116;
                        auVar26._12_4_ = fVar146 * fVar118;
                        auVar26._16_4_ = fVar146 * fVar120;
                        auVar26._20_4_ = fVar146 * fVar75;
                        auVar26._24_4_ = fVar146 * fVar76;
                        auVar26._28_4_ = fVar146;
                        auVar93 = vfmadd231ps_fma(auVar200,auVar104,auVar130);
                        local_2d40 = ZEXT1632(auVar93);
                        uVar65 = *(undefined4 *)(lVar7 + 4 + uVar56 * 4);
                        auVar70._4_4_ = uVar65;
                        auVar70._0_4_ = uVar65;
                        auVar70._8_4_ = uVar65;
                        auVar70._12_4_ = uVar65;
                        auVar70._16_4_ = uVar65;
                        auVar70._20_4_ = uVar65;
                        auVar70._24_4_ = uVar65;
                        auVar70._28_4_ = uVar65;
                        auVar93 = vfmadd231ps_fma(auVar25,auVar104,auVar70);
                        auVar114 = ZEXT1664(auVar93);
                        uVar65 = *(undefined4 *)(lVar7 + 8 + uVar56 * 4);
                        auVar71._4_4_ = uVar65;
                        auVar71._0_4_ = uVar65;
                        auVar71._8_4_ = uVar65;
                        auVar71._12_4_ = uVar65;
                        auVar71._16_4_ = uVar65;
                        auVar71._20_4_ = uVar65;
                        auVar71._24_4_ = uVar65;
                        auVar71._28_4_ = uVar65;
                        auVar93 = vfmadd231ps_fma(auVar26,auVar104,auVar71);
                        auVar186 = ZEXT1664(auVar93);
                      }
                      else {
                        if (tray_00 !=
                            (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *)0x0) {
                          lVar7 = *(long *)&local_2d50[2].numPrimitives;
                          uVar61 = (ulong)*(uint *)(lVar59 + uVar57 * 4);
                          paVar63 = tray_00;
                          uVar56 = local_2d48;
                          do {
                            auVar93 = *(undefined1 (*) [16])
                                       (*(long *)(lVar7 + (long)*(int *)(local_2ce0 + uVar56 * 4) *
                                                          0x38) + uVar61 * 4);
                            auVar68 = *(undefined1 (*) [16])
                                       (*(long *)(lVar7 + 0x38 +
                                                 (long)*(int *)(local_2ce0 + uVar56 * 4) * 0x38) +
                                       uVar61 * 4);
                            *(int *)((long)&local_2ae0 + uVar56 * 4) = auVar93._0_4_;
                            uVar65 = vextractps_avx(auVar93,1);
                            *(undefined4 *)((long)&local_2ac0 + uVar56 * 4) = uVar65;
                            uVar65 = vextractps_avx(auVar93,2);
                            *(undefined4 *)(local_2aa0 + uVar56 * 4) = uVar65;
                            *(int *)(local_2cc0 + uVar56 * 4) = auVar68._0_4_;
                            uVar65 = vextractps_avx(auVar68,1);
                            *(undefined4 *)((long)&local_2ca0 + uVar56 * 4) = uVar65;
                            fVar146 = (float)vextractps_avx(auVar68,2);
                            local_2c80[uVar56] = fVar146;
                            paVar63 = (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1
                                       *)((ulong)paVar63 ^ 1L << (uVar56 & 0x3f));
                            uVar56 = 0;
                            for (paVar14 = paVar63; ((ulong)paVar14 & 1) == 0;
                                paVar14 = (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1
                                           *)((ulong)paVar14 >> 1 | 0x8000000000000000)) {
                              uVar56 = uVar56 + 1;
                            }
                          } while (paVar63 !=
                                   (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *)
                                   0x0);
                          auVar96._8_8_ = uStack_2ad8;
                          auVar96._0_8_ = local_2ae0;
                          auVar96._16_8_ = uStack_2ad0;
                          auVar96._24_8_ = uStack_2ac8;
                          auVar203._8_4_ = local_2cc0._8_4_;
                          auVar203._0_8_ = local_2cc0._0_8_;
                          auVar203._12_4_ = local_2cc0._12_4_;
                          auVar203._16_4_ = local_2cc0._16_4_;
                          auVar203._20_4_ = local_2cc0._20_4_;
                          auVar203._24_4_ = local_2cc0._24_4_;
                          auVar203._28_4_ = local_2cc0._28_4_;
                        }
                        auVar82._8_4_ = 0x3f800000;
                        auVar82._0_8_ = 0x3f8000003f800000;
                        auVar82._12_4_ = 0x3f800000;
                        auVar82._16_4_ = 0x3f800000;
                        auVar82._20_4_ = 0x3f800000;
                        auVar82._24_4_ = 0x3f800000;
                        auVar82._28_4_ = 0x3f800000;
                        auVar104 = vsubps_avx(auVar82,auVar94);
                        fVar77 = auVar104._0_4_;
                        fVar209 = fVar77 * (float)local_2ac0;
                        fVar87 = auVar104._4_4_;
                        fVar211 = fVar87 * local_2ac0._4_4_;
                        fVar88 = auVar104._8_4_;
                        fVar212 = fVar88 * (float)uStack_2ab8;
                        fVar89 = auVar104._12_4_;
                        fVar213 = fVar89 * uStack_2ab8._4_4_;
                        fVar90 = auVar104._16_4_;
                        fVar214 = fVar90 * (float)uStack_2ab0;
                        fVar91 = auVar104._20_4_;
                        fVar215 = fVar91 * uStack_2ab0._4_4_;
                        fVar92 = auVar104._24_4_;
                        fVar216 = fVar92 * (float)uStack_2aa8;
                        fVar220 = fVar77 * (float)local_2aa0._0_4_;
                        fVar222 = fVar87 * (float)local_2aa0._4_4_;
                        fVar223 = fVar88 * fStack_2a98;
                        fVar224 = fVar89 * fStack_2a94;
                        fVar225 = fVar90 * fStack_2a90;
                        fVar226 = fVar91 * fStack_2a8c;
                        fVar227 = fVar92 * fStack_2a88;
                        fVar228 = fVar208 * (float)local_2ca0;
                        fVar230 = fVar107 * local_2ca0._4_4_;
                        fVar231 = fVar116 * fStack_2c98;
                        fVar232 = fVar118 * fStack_2c94;
                        fVar233 = fVar120 * fStack_2c90;
                        fVar234 = fVar75 * fStack_2c8c;
                        fVar235 = fVar76 * fStack_2c88;
                        fVar106 = fVar208 * local_2c80[0];
                        fVar115 = fVar107 * local_2c80[1];
                        fVar117 = fVar116 * local_2c80[2];
                        fVar119 = fVar118 * local_2c80[3];
                        fVar121 = fVar120 * fStack_2c70;
                        fVar122 = fVar75 * fStack_2c6c;
                        fVar123 = fVar76 * fStack_2c68;
                        fVar146 = auVar133._28_4_;
                        if (tray_00 !=
                            (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *)0x0) {
                          lVar7 = *(long *)&local_2d50[2].numPrimitives;
                          uVar61 = (ulong)*(uint *)(lVar59 + 0x10 + uVar57 * 4);
                          paVar63 = tray_00;
                          uVar56 = local_2d48;
                          do {
                            auVar93 = *(undefined1 (*) [16])
                                       (*(long *)(lVar7 + (long)*(int *)(local_2ce0 + uVar56 * 4) *
                                                          0x38) + uVar61 * 4);
                            auVar68 = *(undefined1 (*) [16])
                                       (*(long *)(lVar7 + 0x38 +
                                                 (long)*(int *)(local_2ce0 + uVar56 * 4) * 0x38) +
                                       uVar61 * 4);
                            fVar207 = 0.0;
                            *(int *)((long)&local_2ae0 + uVar56 * 4) = auVar93._0_4_;
                            uVar65 = vextractps_avx(auVar93,1);
                            *(undefined4 *)((long)&local_2ac0 + uVar56 * 4) = uVar65;
                            uVar65 = vextractps_avx(auVar93,2);
                            *(undefined4 *)(local_2aa0 + uVar56 * 4) = uVar65;
                            *(int *)(local_2cc0 + uVar56 * 4) = auVar68._0_4_;
                            uVar65 = vextractps_avx(auVar68,1);
                            *(undefined4 *)((long)&local_2ca0 + uVar56 * 4) = uVar65;
                            fVar146 = (float)vextractps_avx(auVar68,2);
                            local_2c80[uVar56] = fVar146;
                            paVar63 = (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1
                                       *)((ulong)paVar63 ^ 1L << (uVar56 & 0x3f));
                            uVar56 = 0;
                            for (paVar14 = paVar63; ((ulong)paVar14 & 1) == 0;
                                paVar14 = (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1
                                           *)((ulong)paVar14 >> 1 | 0x8000000000000000)) {
                              uVar56 = uVar56 + 1;
                            }
                          } while (paVar63 !=
                                   (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *)
                                   0x0);
                          uStack_2af8 = uStack_2ad8;
                          local_2b00 = (undefined1  [8])local_2ae0;
                          uStack_2af0 = uStack_2ad0;
                          uStack_2ae8 = uStack_2ac8;
                          fStack_2bf8 = (float)local_2cc0._8_4_;
                          local_2c00 = (undefined1  [8])local_2cc0._0_8_;
                          fStack_2bf4 = (float)local_2cc0._12_4_;
                          fStack_2bf0 = (float)local_2cc0._16_4_;
                          fStack_2bec = (float)local_2cc0._20_4_;
                          fStack_2be8 = (float)local_2cc0._24_4_;
                          fStack_2be4 = (float)local_2cc0._28_4_;
                          fVar146 = (float)local_2cc0._28_4_;
                        }
                        fVar124 = fVar77 * (float)local_2ac0;
                        fVar134 = fVar87 * local_2ac0._4_4_;
                        fVar136 = fVar88 * (float)uStack_2ab8;
                        fVar138 = fVar89 * uStack_2ab8._4_4_;
                        fVar140 = fVar90 * (float)uStack_2ab0;
                        fVar142 = fVar91 * uStack_2ab0._4_4_;
                        fVar144 = fVar92 * (float)uStack_2aa8;
                        local_2c20._4_4_ = fVar87 * (float)local_2aa0._4_4_;
                        local_2c20._0_4_ = fVar77 * (float)local_2aa0._0_4_;
                        uStack_2c18._0_4_ = fVar88 * fStack_2a98;
                        uStack_2c18._4_4_ = fVar89 * fStack_2a94;
                        fStack_2c10 = fVar90 * fStack_2a90;
                        fStack_2c0c = fVar91 * fStack_2a8c;
                        fStack_2c08 = fVar92 * fStack_2a88;
                        fStack_2c04 = fVar146;
                        local_2b80._4_4_ = fVar107 * local_2ca0._4_4_;
                        local_2b80._0_4_ = fVar208 * (float)local_2ca0;
                        uStack_2b78._0_4_ = fVar116 * fStack_2c98;
                        uStack_2b78._4_4_ = fVar118 * fStack_2c94;
                        fStack_2b70 = fVar120 * fStack_2c90;
                        fStack_2b6c = fVar75 * fStack_2c8c;
                        fStack_2b68 = fVar76 * fStack_2c88;
                        fStack_2b64 = fVar146;
                        local_2ba0._4_4_ = fVar107 * local_2c80[1];
                        local_2ba0._0_4_ = fVar208 * local_2c80[0];
                        fStack_2b98 = fVar116 * local_2c80[2];
                        fStack_2b94 = fVar118 * local_2c80[3];
                        fStack_2b90 = fVar120 * fStack_2c70;
                        fStack_2b8c = fVar75 * fStack_2c6c;
                        fStack_2b88 = fVar76 * fStack_2c68;
                        fStack_2b84 = fVar146;
                        fVar4 = fVar146;
                        if (tray_00 !=
                            (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *)0x0) {
                          lVar7 = *(long *)&local_2d50[2].numPrimitives;
                          uVar61 = (ulong)*(uint *)(lVar59 + 0x20 + uVar57 * 4);
                          paVar63 = tray_00;
                          uVar56 = local_2d48;
                          do {
                            auVar93 = *(undefined1 (*) [16])
                                       (*(long *)(lVar7 + (long)*(int *)(local_2ce0 + uVar56 * 4) *
                                                          0x38) + uVar61 * 4);
                            auVar68 = *(undefined1 (*) [16])
                                       (*(long *)(lVar7 + 0x38 +
                                                 (long)*(int *)(local_2ce0 + uVar56 * 4) * 0x38) +
                                       uVar61 * 4);
                            fVar207 = 0.0;
                            *(int *)((long)&local_2ae0 + uVar56 * 4) = auVar93._0_4_;
                            uVar65 = vextractps_avx(auVar93,1);
                            *(undefined4 *)((long)&local_2ac0 + uVar56 * 4) = uVar65;
                            uVar65 = vextractps_avx(auVar93,2);
                            *(undefined4 *)(local_2aa0 + uVar56 * 4) = uVar65;
                            *(int *)(local_2cc0 + uVar56 * 4) = auVar68._0_4_;
                            uVar65 = vextractps_avx(auVar68,1);
                            *(undefined4 *)((long)&local_2ca0 + uVar56 * 4) = uVar65;
                            fVar4 = (float)vextractps_avx(auVar68,2);
                            local_2c80[uVar56] = fVar4;
                            paVar63 = (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1
                                       *)((ulong)paVar63 ^ 1L << (uVar56 & 0x3f));
                            uVar56 = 0;
                            for (paVar14 = paVar63; ((ulong)paVar14 & 1) == 0;
                                paVar14 = (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1
                                           *)((ulong)paVar14 >> 1 | 0x8000000000000000)) {
                              uVar56 = uVar56 + 1;
                            }
                          } while (paVar63 !=
                                   (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *)
                                   0x0);
                          auVar50._8_8_ = uStack_2ad8;
                          auVar50._0_8_ = local_2ae0;
                          auVar50._16_8_ = uStack_2ad0;
                          auVar50._24_8_ = uStack_2ac8;
                          auVar218 = auVar50._0_28_;
                          fStack_2b18 = (float)local_2cc0._8_4_;
                          local_2b20 = (undefined1  [8])local_2cc0._0_8_;
                          fStack_2b14 = (float)local_2cc0._12_4_;
                          fStack_2b10 = (float)local_2cc0._16_4_;
                          fStack_2b0c = (float)local_2cc0._20_4_;
                          fStack_2b08 = (float)local_2cc0._24_4_;
                          fStack_2b04 = (float)local_2cc0._28_4_;
                          fVar4 = (float)local_2cc0._28_4_;
                        }
                        fVar125 = fVar77 * (float)local_2ac0;
                        fVar135 = fVar87 * local_2ac0._4_4_;
                        fVar137 = fVar88 * (float)uStack_2ab8;
                        fVar139 = fVar89 * uStack_2ab8._4_4_;
                        fVar141 = fVar90 * (float)uStack_2ab0;
                        fVar143 = fVar91 * uStack_2ab0._4_4_;
                        fVar145 = fVar92 * (float)uStack_2aa8;
                        fVar147 = fVar77 * (float)local_2aa0._0_4_;
                        fVar158 = fVar87 * (float)local_2aa0._4_4_;
                        fVar159 = fVar88 * fStack_2a98;
                        fVar160 = fVar89 * fStack_2a94;
                        fVar161 = fVar90 * fStack_2a90;
                        fVar162 = fVar91 * fStack_2a8c;
                        fVar163 = fVar92 * fStack_2a88;
                        fVar164 = fVar208 * (float)local_2ca0;
                        fVar173 = fVar107 * local_2ca0._4_4_;
                        fVar174 = fVar116 * fStack_2c98;
                        fVar175 = fVar118 * fStack_2c94;
                        fVar176 = fVar120 * fStack_2c90;
                        fVar177 = fVar75 * fStack_2c8c;
                        fVar178 = fVar76 * fStack_2c88;
                        fVar179 = fVar208 * local_2c80[0];
                        fVar187 = fVar107 * local_2c80[1];
                        fVar188 = fVar116 * local_2c80[2];
                        fVar189 = fVar118 * local_2c80[3];
                        fVar190 = fVar120 * fStack_2c70;
                        fVar191 = fVar75 * fStack_2c6c;
                        fVar192 = fVar76 * fStack_2c68;
                        if (tray_00 !=
                            (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *)0x0) {
                          lVar7 = *(long *)&local_2d50[2].numPrimitives;
                          uVar61 = (ulong)*(uint *)(lVar59 + 0x30 + uVar57 * 4);
                          paVar63 = tray_00;
                          uVar56 = local_2d48;
                          do {
                            puVar1 = (undefined4 *)
                                     (*(long *)(lVar7 + (long)*(int *)(local_2ce0 + uVar56 * 4) *
                                                        0x38) + uVar61 * 4);
                            uVar65 = puVar1[1];
                            uVar6 = puVar1[2];
                            auVar93 = *(undefined1 (*) [16])
                                       (*(long *)(lVar7 + 0x38 +
                                                 (long)*(int *)(local_2ce0 + uVar56 * 4) * 0x38) +
                                       uVar61 * 4);
                            *(undefined4 *)((long)&local_2ae0 + uVar56 * 4) = *puVar1;
                            *(undefined4 *)((long)&local_2ac0 + uVar56 * 4) = uVar65;
                            *(undefined4 *)(local_2aa0 + uVar56 * 4) = uVar6;
                            *(int *)(local_2cc0 + uVar56 * 4) = auVar93._0_4_;
                            uVar65 = vextractps_avx(auVar93,1);
                            *(undefined4 *)((long)&local_2ca0 + uVar56 * 4) = uVar65;
                            fVar5 = (float)vextractps_avx(auVar93,2);
                            local_2c80[uVar56] = fVar5;
                            paVar63 = (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1
                                       *)((ulong)paVar63 ^ 1L << (uVar56 & 0x3f));
                            uVar56 = 0;
                            for (paVar14 = paVar63; ((ulong)paVar14 & 1) == 0;
                                paVar14 = (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1
                                           *)((ulong)paVar14 >> 1 | 0x8000000000000000)) {
                              uVar56 = uVar56 + 1;
                            }
                          } while (paVar63 !=
                                   (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *)
                                   0x0);
                          auVar51._8_8_ = uStack_2ad8;
                          auVar51._0_8_ = local_2ae0;
                          auVar51._16_8_ = uStack_2ad0;
                          auVar51._24_8_ = uStack_2ac8;
                          auVar196 = auVar51._0_28_;
                          auVar193._8_4_ = local_2cc0._8_4_;
                          auVar193._0_8_ = local_2cc0._0_8_;
                          auVar193._12_4_ = local_2cc0._12_4_;
                          auVar193._16_4_ = local_2cc0._16_4_;
                          auVar193._20_4_ = local_2cc0._20_4_;
                          auVar193._24_4_ = local_2cc0._24_4_;
                        }
                        auVar98._0_4_ = fVar77 * auVar96._0_4_ + auVar203._0_4_ * fVar208;
                        auVar98._4_4_ = fVar87 * auVar96._4_4_ + auVar203._4_4_ * fVar107;
                        auVar98._8_4_ = fVar88 * auVar96._8_4_ + auVar203._8_4_ * fVar116;
                        auVar98._12_4_ = fVar89 * auVar96._12_4_ + auVar203._12_4_ * fVar118;
                        auVar98._16_4_ = fVar90 * auVar96._16_4_ + auVar203._16_4_ * fVar120;
                        auVar98._20_4_ = fVar91 * auVar96._20_4_ + auVar203._20_4_ * fVar75;
                        auVar98._24_4_ = fVar92 * auVar96._24_4_ + auVar203._24_4_ * fVar76;
                        auVar98._28_4_ = auVar96._28_4_ + fVar67;
                        auVar229 = ZEXT3264(CONCAT428(in_ZMM12._28_4_ + auVar229._28_4_,
                                                      CONCAT424(fVar216 + fVar235,
                                                                CONCAT420(fVar215 + fVar234,
                                                                          CONCAT416(fVar214 + 
                                                  fVar233,CONCAT412(fVar213 + fVar232,
                                                                    CONCAT48(fVar212 + fVar231,
                                                                             CONCAT44(fVar211 + 
                                                  fVar230,fVar209 + fVar228))))))));
                        auVar113._0_4_ = fVar220 + fVar106;
                        auVar113._4_4_ = fVar222 + fVar115;
                        auVar113._8_4_ = fVar223 + fVar117;
                        auVar113._12_4_ = fVar224 + fVar119;
                        auVar113._16_4_ = fVar225 + fVar121;
                        auVar113._20_4_ = fVar226 + fVar122;
                        auVar113._24_4_ = fVar227 + fVar123;
                        auVar113._28_4_ = in_ZMM14._28_4_ + auVar114._28_4_;
                        auVar210._0_4_ =
                             fVar77 * (float)local_2b00._0_4_ + fVar208 * (float)local_2c00._0_4_;
                        auVar210._4_4_ =
                             fVar87 * (float)local_2b00._4_4_ + fVar107 * (float)local_2c00._4_4_;
                        auVar210._8_4_ = fVar88 * (float)uStack_2af8 + fVar116 * fStack_2bf8;
                        auVar210._12_4_ = fVar89 * uStack_2af8._4_4_ + fVar118 * fStack_2bf4;
                        auVar210._16_4_ = fVar90 * (float)uStack_2af0 + fVar120 * fStack_2bf0;
                        auVar210._20_4_ = fVar91 * uStack_2af0._4_4_ + fVar75 * fStack_2bec;
                        auVar210._24_4_ = fVar92 * (float)uStack_2ae8 + fVar76 * fStack_2be8;
                        auVar210._28_4_ = auVar203._28_4_ + in_ZMM12._28_4_;
                        auVar86 = ZEXT3264(CONCAT428(fStack_2b64 + fVar146,
                                                     CONCAT424(fStack_2b68 + fVar144,
                                                               CONCAT420(fStack_2b6c + fVar142,
                                                                         CONCAT416(fStack_2b70 +
                                                                                   fVar140,CONCAT412
                                                  (uStack_2b78._4_4_ + fVar138,
                                                   CONCAT48((float)uStack_2b78 + fVar136,
                                                            CONCAT44((float)local_2b80._4_4_ +
                                                                     fVar134,(float)local_2b80._0_4_
                                                                             + fVar124))))))));
                        auVar221._0_4_ = (float)local_2ba0._0_4_ + (float)local_2c20._0_4_;
                        auVar221._4_4_ = (float)local_2ba0._4_4_ + (float)local_2c20._4_4_;
                        auVar221._8_4_ = fStack_2b98 + (float)uStack_2c18;
                        auVar221._12_4_ = fStack_2b94 + uStack_2c18._4_4_;
                        auVar221._16_4_ = fStack_2b90 + fStack_2c10;
                        auVar221._20_4_ = fStack_2b8c + fStack_2c0c;
                        auVar221._24_4_ = fStack_2b88 + fStack_2c08;
                        auVar221._28_4_ = fStack_2b84 + fStack_2c04;
                        local_2c00._4_4_ =
                             auVar218._4_4_ * fVar87 + fVar107 * (float)local_2b20._4_4_;
                        local_2c00._0_4_ =
                             auVar218._0_4_ * fVar77 + fVar208 * (float)local_2b20._0_4_;
                        fStack_2bf8 = auVar218._8_4_ * fVar88 + fVar116 * fStack_2b18;
                        fStack_2bf4 = auVar218._12_4_ * fVar89 + fVar118 * fStack_2b14;
                        fStack_2bf0 = auVar218._16_4_ * fVar90 + fVar120 * fStack_2b10;
                        fStack_2bec = auVar218._20_4_ * fVar91 + fVar75 * fStack_2b0c;
                        fStack_2be8 = auVar218._24_4_ * fVar92 + fVar76 * fStack_2b08;
                        fStack_2be4 = fStack_2b84 + auVar210._28_4_;
                        fVar67 = auVar172._28_4_;
                        local_2b00._4_4_ = fVar135 + fVar173;
                        local_2b00._0_4_ = fVar125 + fVar164;
                        uStack_2af8._0_4_ = fVar137 + fVar174;
                        uStack_2af8._4_4_ = fVar139 + fVar175;
                        uStack_2af0._0_4_ = fVar141 + fVar176;
                        uStack_2af0._4_4_ = fVar143 + fVar177;
                        uStack_2ae8._0_4_ = fVar145 + fVar178;
                        uStack_2ae8._4_4_ = fVar4 + fVar67;
                        fStack_2b04 = auVar186._28_4_ + fVar207;
                        local_2b20._4_4_ = fVar187 + fVar158;
                        local_2b20._0_4_ = fVar179 + fVar147;
                        fStack_2b18 = fVar188 + fVar159;
                        fStack_2b14 = fVar189 + fVar160;
                        fStack_2b10 = fVar190 + fVar161;
                        fStack_2b0c = fVar191 + fVar162;
                        fStack_2b08 = fVar192 + fVar163;
                        local_2d40._0_4_ = auVar196._0_4_ * fVar77 + auVar193._0_4_ * fVar208;
                        local_2d40._4_4_ = auVar196._4_4_ * fVar87 + auVar193._4_4_ * fVar107;
                        local_2d40._8_4_ = auVar196._8_4_ * fVar88 + auVar193._8_4_ * fVar116;
                        local_2d40._12_4_ = auVar196._12_4_ * fVar89 + auVar193._12_4_ * fVar118;
                        local_2d40._16_4_ = auVar196._16_4_ * fVar90 + auVar193._16_4_ * fVar120;
                        local_2d40._20_4_ = auVar196._20_4_ * fVar91 + auVar193._20_4_ * fVar75;
                        local_2d40._24_4_ = auVar196._24_4_ * fVar92 + auVar193._24_4_ * fVar76;
                        local_2d40._28_4_ = fStack_2b04 + fVar67;
                        auVar130._4_4_ = fVar107 * local_2ca0._4_4_;
                        auVar130._0_4_ = fVar208 * (float)local_2ca0;
                        auVar130._8_4_ = fVar116 * fStack_2c98;
                        auVar130._12_4_ = fVar118 * fStack_2c94;
                        auVar130._16_4_ = fVar120 * fStack_2c90;
                        auVar130._20_4_ = fVar75 * fStack_2c8c;
                        auVar130._24_4_ = fVar76 * fStack_2c88;
                        auVar130._28_4_ = fStack_2b04;
                        auVar114 = ZEXT3264(CONCAT428(fVar207 + fStack_2b04,
                                                      CONCAT424(fVar92 * (float)uStack_2aa8 +
                                                                fVar76 * fStack_2c88,
                                                                CONCAT420(fVar91 * uStack_2ab0._4_4_
                                                                          + fVar75 * fStack_2c8c,
                                                                          CONCAT416(fVar90 * (float)
                                                  uStack_2ab0 + fVar120 * fStack_2c90,
                                                  CONCAT412(fVar89 * uStack_2ab8._4_4_ +
                                                            fVar118 * fStack_2c94,
                                                            CONCAT48(fVar88 * (float)uStack_2ab8 +
                                                                     fVar116 * fStack_2c98,
                                                                     CONCAT44(fVar87 * local_2ac0.
                                                                                       _4_4_ +
                                                                              fVar107 * local_2ca0.
                                                                                        _4_4_,
                                                                              fVar77 * (float)
                                                  local_2ac0 + fVar208 * (float)local_2ca0))))))));
                        auVar186 = ZEXT3264(CONCAT428(auVar104._28_4_ + auVar94._28_4_,
                                                      CONCAT424(fVar92 * fStack_2a88 +
                                                                fVar76 * fStack_2c68,
                                                                CONCAT420(fVar91 * fStack_2a8c +
                                                                          fVar75 * fStack_2c6c,
                                                                          CONCAT416(fVar90 * 
                                                  fStack_2a90 + fVar120 * fStack_2c70,
                                                  CONCAT412(fVar89 * fStack_2a94 +
                                                            fVar118 * local_2c80[3],
                                                            CONCAT48(fVar88 * fStack_2a98 +
                                                                     fVar116 * local_2c80[2],
                                                                     CONCAT44(fVar87 * (float)
                                                  local_2aa0._4_4_ + fVar107 * local_2c80[1],
                                                  fVar77 * (float)local_2aa0._0_4_ +
                                                  fVar208 * local_2c80[0]))))))));
                      }
                      _local_2c20 = auVar210;
                      local_2c60._0_32_ = vsubps_avx(auVar98,auVar210);
                      _local_2b80 = auVar86._0_32_;
                      auVar104 = auVar229._0_32_;
                      local_2b40 = vsubps_avx(auVar104,auVar86._0_32_);
                      _local_2ba0 = auVar221;
                      auVar108 = vsubps_avx(auVar113,auVar221);
                      auVar204 = ZEXT3264(auVar108);
                      auVar109 = vsubps_avx(local_2d40,auVar98);
                      local_2860 = auVar114._0_32_;
                      auVar197 = vsubps_avx(auVar114._0_32_,auVar104);
                      local_2880 = auVar186._0_32_;
                      auVar198 = vsubps_avx(auVar186._0_32_,auVar113);
                      auVar48._4_4_ = auVar198._4_4_ * local_2b40._4_4_;
                      auVar48._0_4_ = auVar198._0_4_ * local_2b40._0_4_;
                      auVar48._8_4_ = auVar198._8_4_ * local_2b40._8_4_;
                      auVar48._12_4_ = auVar198._12_4_ * local_2b40._12_4_;
                      auVar48._16_4_ = auVar198._16_4_ * local_2b40._16_4_;
                      auVar48._20_4_ = auVar198._20_4_ * local_2b40._20_4_;
                      auVar48._24_4_ = auVar198._24_4_ * local_2b40._24_4_;
                      auVar48._28_4_ = auVar130._28_4_;
                      auVar15 = vfmsub231ps_fma(auVar48,auVar197,auVar108);
                      auVar133 = ZEXT1664(auVar15);
                      auVar172._0_4_ = auVar108._0_4_ * auVar109._0_4_;
                      auVar172._4_4_ = auVar108._4_4_ * auVar109._4_4_;
                      auVar172._8_4_ = auVar108._8_4_ * auVar109._8_4_;
                      auVar172._12_4_ = auVar108._12_4_ * auVar109._12_4_;
                      auVar172._16_4_ = auVar108._16_4_ * auVar109._16_4_;
                      auVar172._20_4_ = auVar108._20_4_ * auVar109._20_4_;
                      auVar172._28_36_ = auVar114._28_36_;
                      auVar172._24_4_ = auVar108._24_4_ * auVar109._24_4_;
                      auVar16 = vfmsub231ps_fma(auVar172._0_32_,auVar198,local_2c60._0_32_);
                      auVar157 = ZEXT1664(auVar16);
                      auVar49._4_4_ = auVar197._4_4_ * local_2c60._4_4_;
                      auVar49._0_4_ = auVar197._0_4_ * local_2c60._0_4_;
                      auVar49._8_4_ = auVar197._8_4_ * local_2c60._8_4_;
                      auVar49._12_4_ = auVar197._12_4_ * local_2c60._12_4_;
                      auVar49._16_4_ = auVar197._16_4_ * local_2c60._16_4_;
                      auVar49._20_4_ = auVar197._20_4_ * local_2c60._20_4_;
                      auVar49._24_4_ = auVar197._24_4_ * local_2c60._24_4_;
                      auVar49._28_4_ = fVar67;
                      auVar100 = vsubps_avx(auVar98,*(undefined1 (*) [32])ray);
                      auVar11 = vsubps_avx(auVar104,*(undefined1 (*) [32])(ray + 0x20));
                      auVar195 = ZEXT3264(auVar11);
                      auVar17 = vfmsub231ps_fma(auVar49,auVar109,local_2b40);
                      auVar172 = ZEXT1664(auVar17);
                      auVar12 = vsubps_avx(auVar113,*(undefined1 (*) [32])(ray + 0x40));
                      auVar201 = ZEXT3264(auVar12);
                      auVar104 = *(undefined1 (*) [32])(ray + 0x80);
                      auVar94 = *(undefined1 (*) [32])(ray + 0xa0);
                      auVar101 = *(undefined1 (*) [32])(ray + 0xc0);
                      auVar105._0_4_ = auVar11._0_4_ * auVar104._0_4_;
                      auVar105._4_4_ = auVar11._4_4_ * auVar104._4_4_;
                      auVar105._8_4_ = auVar11._8_4_ * auVar104._8_4_;
                      auVar105._12_4_ = auVar11._12_4_ * auVar104._12_4_;
                      auVar105._16_4_ = auVar11._16_4_ * auVar104._16_4_;
                      auVar105._20_4_ = auVar11._20_4_ * auVar104._20_4_;
                      auVar105._28_36_ = auVar229._28_36_;
                      auVar105._24_4_ = auVar11._24_4_ * auVar104._24_4_;
                      auVar165 = vfmsub231ps_fma(auVar105._0_32_,auVar100,auVar94);
                      auVar229._0_4_ = auVar17._0_4_ * auVar101._0_4_;
                      auVar229._4_4_ = auVar17._4_4_ * auVar101._4_4_;
                      auVar229._8_4_ = auVar17._8_4_ * auVar101._8_4_;
                      auVar229._12_4_ = auVar17._12_4_ * auVar101._12_4_;
                      auVar229._16_4_ = auVar101._16_4_ * 0.0;
                      auVar229._20_4_ = auVar101._20_4_ * 0.0;
                      auVar229._28_36_ = auVar186._28_36_;
                      auVar229._24_4_ = auVar101._24_4_ * 0.0;
                      auVar102 = ZEXT1632(auVar16);
                      auVar93 = vfmadd231ps_fma(auVar229._0_32_,auVar102,auVar94);
                      auVar186._0_4_ = auVar12._0_4_ * auVar94._0_4_;
                      auVar186._4_4_ = auVar12._4_4_ * auVar94._4_4_;
                      auVar186._8_4_ = auVar12._8_4_ * auVar94._8_4_;
                      auVar186._12_4_ = auVar12._12_4_ * auVar94._12_4_;
                      auVar186._16_4_ = auVar12._16_4_ * auVar94._16_4_;
                      auVar186._20_4_ = auVar12._20_4_ * auVar94._20_4_;
                      auVar186._28_36_ = auVar86._28_36_;
                      auVar186._24_4_ = auVar12._24_4_ * auVar94._24_4_;
                      auVar148 = vfmsub231ps_fma(auVar186._0_32_,auVar11,auVar101);
                      auVar27._4_4_ = auVar101._4_4_ * auVar100._4_4_;
                      auVar27._0_4_ = auVar101._0_4_ * auVar100._0_4_;
                      auVar27._8_4_ = auVar101._8_4_ * auVar100._8_4_;
                      auVar27._12_4_ = auVar101._12_4_ * auVar100._12_4_;
                      auVar27._16_4_ = auVar101._16_4_ * auVar100._16_4_;
                      auVar27._20_4_ = auVar101._20_4_ * auVar100._20_4_;
                      auVar27._24_4_ = auVar101._24_4_ * auVar100._24_4_;
                      auVar27._28_4_ = auVar94._28_4_;
                      auVar149 = vfmsub231ps_fma(auVar27,auVar12,auVar104);
                      auVar131 = ZEXT1632(auVar15);
                      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar131,auVar104);
                      auVar186 = ZEXT1664(auVar93);
                      auVar28._4_4_ = auVar198._4_4_ * auVar165._4_4_;
                      auVar28._0_4_ = auVar198._0_4_ * auVar165._0_4_;
                      auVar28._8_4_ = auVar198._8_4_ * auVar165._8_4_;
                      auVar28._12_4_ = auVar198._12_4_ * auVar165._12_4_;
                      auVar28._16_4_ = auVar198._16_4_ * 0.0;
                      auVar28._20_4_ = auVar198._20_4_ * 0.0;
                      auVar28._24_4_ = auVar198._24_4_ * 0.0;
                      auVar28._28_4_ = auVar104._28_4_;
                      auVar68 = vfmadd231ps_fma(auVar28,ZEXT1632(auVar149),auVar197);
                      local_28a0._8_4_ = 0x80000000;
                      local_28a0._0_8_ = 0x8000000080000000;
                      local_28a0._12_4_ = 0x80000000;
                      local_28a0._16_4_ = 0x80000000;
                      local_28a0._20_4_ = 0x80000000;
                      local_28a0._24_4_ = 0x80000000;
                      local_28a0._28_4_ = 0x80000000;
                      auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),ZEXT1632(auVar148),auVar109);
                      auVar104 = vandps_avx(ZEXT1632(auVar93),local_28a0);
                      in_ZMM12 = ZEXT3264(auVar104);
                      uVar202 = auVar104._0_4_;
                      auVar217._0_4_ = (float)(uVar202 ^ auVar68._0_4_);
                      uVar58 = auVar104._4_4_;
                      auVar217._4_4_ = (float)(uVar58 ^ auVar68._4_4_);
                      uVar205 = auVar104._8_4_;
                      auVar217._8_4_ = (float)(uVar205 ^ auVar68._8_4_);
                      uVar206 = auVar104._12_4_;
                      auVar217._12_4_ = (float)(uVar206 ^ auVar68._12_4_);
                      fVar207 = auVar104._16_4_;
                      auVar219._16_4_ = fVar207;
                      auVar219._0_16_ = auVar217;
                      fVar67 = auVar104._20_4_;
                      auVar219._20_4_ = fVar67;
                      fVar208 = auVar104._24_4_;
                      auVar219._24_4_ = fVar208;
                      uVar65 = auVar104._28_4_;
                      auVar219._28_4_ = uVar65;
                      in_ZMM13 = ZEXT3264(auVar219);
                      auVar94 = vcmpps_avx(auVar219,_DAT_01faff00,5);
                      in_ZMM14 = ZEXT3264(auVar94);
                      auVar101 = auVar95 & auVar94;
                      local_2d20._0_32_ = auVar95;
                      local_2ce4 = iVar55;
                      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar101 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar101 >> 0x7f,0) == '\0') &&
                            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar101 >> 0xbf,0) == '\0') &&
                          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar101[0x1f]) {
                        auVar229 = ZEXT3264(CONCAT428(0x7f800000,
                                                      CONCAT424(0x7f800000,
                                                                CONCAT420(0x7f800000,
                                                                          CONCAT416(0x7f800000,
                                                                                    CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                        auVar104 = vpcmpeqd_avx2(local_28a0,local_28a0);
                        auVar86 = ZEXT3264(auVar104);
                      }
                      else {
                        local_29a0 = ZEXT1632(auVar17);
                        local_2980 = auVar102;
                        auVar198 = local_2980;
                        local_2960 = auVar131;
                        auVar131 = local_2960;
                        auVar94 = vandps_avx(auVar94,auVar95);
                        in_ZMM14 = ZEXT3264(auVar94);
                        auVar36._4_4_ = auVar108._4_4_ * auVar165._4_4_;
                        auVar36._0_4_ = auVar108._0_4_ * auVar165._0_4_;
                        auVar36._8_4_ = auVar108._8_4_ * auVar165._8_4_;
                        auVar36._12_4_ = auVar108._12_4_ * auVar165._12_4_;
                        auVar36._16_4_ = auVar108._16_4_ * 0.0;
                        auVar36._20_4_ = auVar108._20_4_ * 0.0;
                        auVar36._24_4_ = auVar108._24_4_ * 0.0;
                        auVar36._28_4_ = auVar74._28_4_;
                        auVar68 = vfmadd213ps_fma(local_2b40,ZEXT1632(auVar149),auVar36);
                        auVar165 = vfmadd213ps_fma(local_2c60._0_32_,ZEXT1632(auVar148),
                                                   ZEXT1632(auVar68));
                        auVar170._0_4_ = (float)(uVar202 ^ auVar165._0_4_);
                        auVar170._4_4_ = (float)(uVar58 ^ auVar165._4_4_);
                        auVar170._8_4_ = (float)(uVar205 ^ auVar165._8_4_);
                        auVar170._12_4_ = (float)(uVar206 ^ auVar165._12_4_);
                        auVar170._16_4_ = fVar207;
                        auVar170._20_4_ = fVar67;
                        auVar170._24_4_ = fVar208;
                        auVar170._28_4_ = uVar65;
                        auVar172 = ZEXT3264(auVar170);
                        auVar101 = vcmpps_avx(auVar170,_DAT_01faff00,5);
                        auVar109 = auVar94 & auVar101;
                        auVar197 = vpcmpeqd_avx2(ZEXT1632(auVar68),ZEXT1632(auVar68));
                        auVar86 = ZEXT3264(auVar197);
                        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar109 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar109 >> 0x7f,0) != '\0')
                              || (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar109 >> 0xbf,0) != '\0') ||
                            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar109[0x1f] < '\0') {
                          auVar109 = vandps_avx(ZEXT1632(auVar93),
                                                (undefined1  [32])local_2a00.field_0.z.field_0);
                          auVar101 = vandps_avx(auVar94,auVar101);
                          auVar197 = vsubps_avx(auVar109,auVar219);
                          auVar197 = vcmpps_avx(auVar197,auVar170,5);
                          auVar110 = auVar101 & auVar197;
                          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar110 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar110 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar110 >> 0x7f,0) != '\0') ||
                                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar110 >> 0xbf,0) != '\0') ||
                              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar110[0x1f] < '\0') {
                            local_2c60._0_8_ = tray_00;
                            auVar101 = vandps_avx(auVar197,auVar101);
                            auVar38._4_4_ = auVar12._4_4_ * auVar17._4_4_;
                            auVar38._0_4_ = auVar12._0_4_ * auVar17._0_4_;
                            auVar38._8_4_ = auVar12._8_4_ * auVar17._8_4_;
                            auVar38._12_4_ = auVar12._12_4_ * auVar17._12_4_;
                            auVar38._16_4_ = auVar12._16_4_ * 0.0;
                            auVar38._20_4_ = auVar12._20_4_ * 0.0;
                            auVar38._24_4_ = auVar12._24_4_ * 0.0;
                            auVar38._28_4_ = auVar197._28_4_;
                            auVar68 = vfmadd132ps_fma(auVar11,auVar38,auVar102);
                            auVar195 = ZEXT1664(auVar68);
                            auVar165 = vfmadd132ps_fma(auVar100,ZEXT1632(auVar68),auVar131);
                            auVar148._0_4_ = (float)(uVar202 ^ auVar165._0_4_);
                            auVar148._4_4_ = (float)(uVar58 ^ auVar165._4_4_);
                            auVar148._8_4_ = (float)(uVar205 ^ auVar165._8_4_);
                            auVar148._12_4_ = (float)(uVar206 ^ auVar165._12_4_);
                            auVar155._16_4_ = fVar207;
                            auVar155._0_16_ = auVar148;
                            auVar155._20_4_ = fVar67;
                            auVar155._24_4_ = fVar208;
                            auVar155._28_4_ = uVar65;
                            auVar157 = ZEXT3264(auVar155);
                            auVar39._4_4_ = auVar109._4_4_ * *(float *)(ray + 100);
                            auVar39._0_4_ = auVar109._0_4_ * *(float *)(ray + 0x60);
                            auVar39._8_4_ = auVar109._8_4_ * *(float *)(ray + 0x68);
                            auVar39._12_4_ = auVar109._12_4_ * *(float *)(ray + 0x6c);
                            auVar39._16_4_ = auVar109._16_4_ * *(float *)(ray + 0x70);
                            auVar39._20_4_ = auVar109._20_4_ * *(float *)(ray + 0x74);
                            auVar39._24_4_ = auVar109._24_4_ * *(float *)(ray + 0x78);
                            auVar39._28_4_ = auVar197._28_4_;
                            auVar197 = vcmpps_avx(auVar39,auVar155,1);
                            local_2b40 = *(undefined1 (*) [32])(ray + 0x100);
                            auVar40._4_4_ = auVar109._4_4_ * *(float *)(ray + 0x104);
                            auVar40._0_4_ = auVar109._0_4_ * *(float *)(ray + 0x100);
                            auVar40._8_4_ = auVar109._8_4_ * *(float *)(ray + 0x108);
                            auVar40._12_4_ = auVar109._12_4_ * *(float *)(ray + 0x10c);
                            auVar40._16_4_ = auVar109._16_4_ * *(float *)(ray + 0x110);
                            auVar40._20_4_ = auVar109._20_4_ * *(float *)(ray + 0x114);
                            auVar40._24_4_ = auVar109._24_4_ * *(float *)(ray + 0x118);
                            auVar40._28_4_ = *(undefined4 *)(ray + 0x11c);
                            auVar83 = vcmpps_avx(auVar155,auVar40,2);
                            auVar197 = vandps_avx(auVar83,auVar197);
                            auVar100 = auVar101 & auVar197;
                            if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar100 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar100 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar100 >> 0x7f,0) == '\0') &&
                                  (auVar100 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar100 >> 0xbf,0) == '\0') &&
                                (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar100[0x1f]) {
LAB_00547f7d:
                              auVar104 = vpcmpeqd_avx2(auVar83,auVar83);
                            }
                            else {
                              auVar101 = vandps_avx(auVar197,auVar101);
                              auVar197 = vcmpps_avx(ZEXT1632(auVar93),_DAT_01faff00,4);
                              auVar100 = auVar101 & auVar197;
                              if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar100 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar100 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar100 >> 0x7f,0) == '\0')
                                    && (auVar100 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar100 >> 0xbf,0) == '\0')
                                  && (auVar100 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar100[0x1f])
                              goto LAB_00547f7d;
                              auVar101 = vandps_avx(auVar197,auVar101);
                              uVar202 = local_2d50->mask;
                              auVar72._4_4_ = uVar202;
                              auVar72._0_4_ = uVar202;
                              auVar72._8_4_ = uVar202;
                              auVar72._12_4_ = uVar202;
                              auVar72._16_4_ = uVar202;
                              auVar72._20_4_ = uVar202;
                              auVar72._24_4_ = uVar202;
                              auVar72._28_4_ = uVar202;
                              auVar197 = vpand_avx2(auVar72,*(undefined1 (*) [32])(ray + 0x120));
                              auVar100 = vpcmpeqd_avx2(auVar197,_DAT_01faff00);
                              auVar197 = auVar101 & ~auVar100;
                              if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar197 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar197 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar197 >> 0x7f,0) == '\0')
                                    && (auVar197 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && SUB321(auVar197 >> 0xbf,0) == '\0')
                                  && (auVar197 & (undefined1  [32])0x100000000) ==
                                     (undefined1  [32])0x0) && -1 < auVar197[0x1f])
                              goto LAB_00547f7d;
                              auVar95 = vandnps_avx(auVar100,auVar101);
                              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                 (local_2d50->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                auVar101 = vrcpps_avx(auVar109);
                                auVar184._8_4_ = 0x3f800000;
                                auVar184._0_8_ = 0x3f8000003f800000;
                                auVar184._12_4_ = 0x3f800000;
                                auVar184._16_4_ = 0x3f800000;
                                auVar184._20_4_ = 0x3f800000;
                                auVar184._24_4_ = 0x3f800000;
                                auVar184._28_4_ = 0x3f800000;
                                auVar93 = vfnmadd213ps_fma(auVar109,auVar101,auVar184);
                                auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar101,auVar101);
                                fVar107 = auVar93._0_4_;
                                fVar116 = auVar93._4_4_;
                                auVar44._4_4_ = auVar217._4_4_ * fVar116;
                                auVar44._0_4_ = auVar217._0_4_ * fVar107;
                                fVar118 = auVar93._8_4_;
                                auVar44._8_4_ = auVar217._8_4_ * fVar118;
                                fVar120 = auVar93._12_4_;
                                auVar44._12_4_ = auVar217._12_4_ * fVar120;
                                auVar44._16_4_ = fVar207 * 0.0;
                                auVar44._20_4_ = fVar67 * 0.0;
                                auVar44._24_4_ = fVar208 * 0.0;
                                auVar44._28_4_ = auVar101._28_4_;
                                auVar101 = vminps_avx(auVar44,auVar184);
                                auVar45._4_4_ = fVar116 * auVar170._4_4_;
                                auVar45._0_4_ = fVar107 * auVar170._0_4_;
                                auVar45._8_4_ = fVar118 * auVar170._8_4_;
                                auVar45._12_4_ = fVar120 * auVar170._12_4_;
                                auVar45._16_4_ = fVar207 * 0.0;
                                auVar45._20_4_ = fVar67 * 0.0;
                                auVar45._24_4_ = fVar208 * 0.0;
                                auVar45._28_4_ = auVar83._28_4_;
                                auVar109 = vminps_avx(auVar45,auVar184);
                                auVar197 = vsubps_avx(auVar184,auVar101);
                                auVar100 = vsubps_avx(auVar184,auVar109);
                                auVar93._8_8_ = uStack_28d8;
                                auVar93._0_8_ = local_28e0;
                                auVar54._16_8_ = uStack_28d0;
                                auVar54._0_16_ = auVar93;
                                auVar54._24_8_ = uStack_28c8;
                                auVar186 = ZEXT3264(auVar54);
                                local_2a80 = vblendvps_avx(auVar101,auVar197,auVar54);
                                local_2a60 = vblendvps_avx(auVar109,auVar100,auVar54);
                                pRVar9 = context->user;
                                auVar165._4_4_ = iVar55;
                                auVar165._0_4_ = iVar55;
                                auVar165._8_4_ = iVar55;
                                auVar165._12_4_ = iVar55;
                                local_2a40._16_4_ = iVar55;
                                local_2a40._0_16_ = auVar165;
                                local_2a40._20_4_ = iVar55;
                                local_2a40._24_4_ = iVar55;
                                local_2a40._28_4_ = iVar55;
                                auVar172 = ZEXT3264(local_2a40);
                                local_2960._0_8_ = auVar15._0_8_;
                                local_2960._8_8_ = auVar15._8_8_;
                                local_2ae0 = local_2960._0_8_;
                                uStack_2ad8 = local_2960._8_8_;
                                uStack_2ad0 = 0;
                                uStack_2ac8 = 0;
                                local_2980._0_8_ = auVar16._0_8_;
                                local_2980._8_8_ = auVar16._8_8_;
                                local_2ac0 = local_2980._0_8_;
                                uStack_2ab8 = local_2980._8_8_;
                                uStack_2ab0 = 0;
                                uStack_2aa8 = 0;
                                auVar133 = ZEXT3264(local_29a0);
                                _local_2aa0 = local_29a0;
                                local_2a20._4_4_ = (undefined4)local_2bb0;
                                local_2a20._0_4_ = (undefined4)local_2bb0;
                                local_2a20._8_4_ = (undefined4)local_2bb0;
                                local_2a20._12_4_ = (undefined4)local_2bb0;
                                local_2a20._16_4_ = (undefined4)local_2bb0;
                                local_2a20._20_4_ = (undefined4)local_2bb0;
                                local_2a20._24_4_ = (undefined4)local_2bb0;
                                local_2a20._28_4_ = (undefined4)local_2bb0;
                                aVar13 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                         vpcmpeqd_avx2(local_2a80,local_2a80);
                                local_2980 = auVar198;
                                local_2960 = auVar131;
                                local_2c28->components[1].field_0 = aVar13;
                                (((Vec3vf<8> *)&(local_2c28->field_0).x)->field_0).field_0.x.field_0
                                     = aVar13;
                                local_2a00._0_4_ = pRVar9->instID[0];
                                local_2a00._4_4_ = local_2a00._0_4_;
                                local_2a00._8_4_ = local_2a00._0_4_;
                                local_2a00._12_4_ = local_2a00._0_4_;
                                local_2a00._16_4_ = local_2a00._0_4_;
                                local_2a00._20_4_ = local_2a00._0_4_;
                                local_2a00._24_4_ = local_2a00._0_4_;
                                local_2a00._28_4_ = local_2a00._0_4_;
                                local_2a00._32_4_ = pRVar9->instPrimID[0];
                                auVar83._4_4_ = fVar116 * auVar148._4_4_;
                                auVar83._0_4_ = fVar107 * auVar148._0_4_;
                                auVar83._8_4_ = fVar118 * auVar148._8_4_;
                                auVar83._12_4_ = fVar120 * auVar148._12_4_;
                                auVar83._16_4_ = fVar207 * 0.0;
                                auVar83._20_4_ = fVar67 * 0.0;
                                auVar83._24_4_ = fVar208 * 0.0;
                                auVar83._28_4_ = local_2a60._28_4_;
                                local_2a00._36_4_ = local_2a00._32_4_;
                                local_2a00._40_4_ = local_2a00._32_4_;
                                local_2a00._44_4_ = local_2a00._32_4_;
                                local_2a00._48_4_ = local_2a00._32_4_;
                                local_2a00._52_4_ = local_2a00._32_4_;
                                local_2a00._56_4_ = local_2a00._32_4_;
                                local_2a00._60_4_ = local_2a00._32_4_;
                                auVar101 = vblendvps_avx(local_2b40,auVar83,auVar95);
                                *(undefined1 (*) [32])(ray + 0x100) = auVar101;
                                local_2ce0 = auVar95;
                                local_2cc0._0_4_ = SUB84(local_2ce0,0);
                                local_2cc0._4_4_ = (undefined4)((ulong)local_2ce0 >> 0x20);
                                local_2cc0._8_4_ = SUB84(local_2d50->userPtr,0);
                                local_2cc0._12_4_ = (undefined4)((ulong)local_2d50->userPtr >> 0x20)
                                ;
                                local_2cc0._16_4_ = SUB84(context->user,0);
                                local_2cc0._20_4_ = (undefined4)((ulong)context->user >> 0x20);
                                local_2ca0 = (RTCHitN *)&local_2ae0;
                                fStack_2c98 = 1.12104e-44;
                                local_2cc0._0_8_ = local_2ce0;
                                local_2cc0._24_8_ = ray;
                                if (local_2d50->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                  auVar133 = ZEXT1664(auVar17);
                                  auVar157 = ZEXT1664(auVar148);
                                  auVar172 = ZEXT1664(auVar165);
                                  auVar186 = ZEXT1664(auVar93);
                                  auVar195 = ZEXT1664(auVar68);
                                  auVar201 = ZEXT1664(auVar12._0_16_);
                                  auVar204 = ZEXT1664(auVar108._0_16_);
                                  in_ZMM12 = ZEXT1664(auVar104._0_16_);
                                  in_ZMM13 = ZEXT1664(auVar217);
                                  in_ZMM14 = ZEXT1664(auVar94._0_16_);
                                  (*local_2d50->occlusionFilterN)
                                            ((RTCFilterFunctionNArguments *)local_2cc0);
                                  auVar86._8_56_ = extraout_var;
                                  auVar86._0_8_ = extraout_XMM1_Qa;
                                  auVar83 = auVar86._0_32_;
                                }
                                auVar95 = vpcmpeqd_avx2(local_2ce0,_DAT_01faff00);
                                auVar104 = _DAT_01fe9960 & ~auVar95;
                                if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0 &&
                                         (auVar104 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar104 >> 0x5f & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar104 >> 0x7f,0) == '\0'
                                       ) && (auVar104 & (undefined1  [32])0x100000000) ==
                                            (undefined1  [32])0x0) &&
                                     SUB321(auVar104 >> 0xbf,0) == '\0') &&
                                    (auVar104 & (undefined1  [32])0x100000000) ==
                                    (undefined1  [32])0x0) && -1 < auVar104[0x1f]) {
                                  auVar95 = auVar95 ^ _DAT_01fe9960;
                                }
                                else {
                                  p_Var10 = context->args->filter;
                                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((local_2d50->field_8).field_0x2 & 0x40) != 0)))) {
                                    auVar133 = ZEXT1664(auVar133._0_16_);
                                    auVar157 = ZEXT1664(auVar157._0_16_);
                                    auVar172 = ZEXT1664(auVar172._0_16_);
                                    auVar186 = ZEXT1664(auVar186._0_16_);
                                    auVar195 = ZEXT1664(auVar195._0_16_);
                                    auVar201 = ZEXT1664(auVar201._0_16_);
                                    auVar204 = ZEXT1664(auVar204._0_16_);
                                    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                    in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                    in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                    (*p_Var10)((RTCFilterFunctionNArguments *)local_2cc0);
                                  }
                                  auVar104 = vpcmpeqd_avx2(local_2ce0,_DAT_01faff00);
                                  auVar95 = auVar104 ^ _DAT_01fe9960;
                                  auVar83._8_4_ = 0xff800000;
                                  auVar83._0_8_ = 0xff800000ff800000;
                                  auVar83._12_4_ = 0xff800000;
                                  auVar83._16_4_ = 0xff800000;
                                  auVar83._20_4_ = 0xff800000;
                                  auVar83._24_4_ = 0xff800000;
                                  auVar83._28_4_ = 0xff800000;
                                  auVar104 = vblendvps_avx(auVar83,*(undefined1 (*) [32])
                                                                    (local_2cc0._24_8_ + 0x100),
                                                           auVar104);
                                  *(undefined1 (*) [32])(local_2cc0._24_8_ + 0x100) = auVar104;
                                }
                                auVar104 = vblendvps_avx(local_2b40,*(undefined1 (*) [32])local_2cf0
                                                         ,auVar95);
                                *(undefined1 (*) [32])local_2cf0 = auVar104;
                              }
                              auVar95 = vandnps_avx(auVar95,local_2d20._0_32_);
                              auVar104 = vpcmpeqd_avx2(auVar83,auVar83);
                            }
                            auVar229 = ZEXT3264(CONCAT428(0x7f800000,
                                                          CONCAT424(0x7f800000,
                                                                    CONCAT420(0x7f800000,
                                                                              CONCAT416(0x7f800000,
                                                                                        CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                            auVar86 = ZEXT3264(auVar104);
                            tray_00 = (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1
                                       *)local_2c60._0_8_;
                            goto LAB_00547653;
                          }
                        }
                        auVar229 = ZEXT3264(CONCAT428(0x7f800000,
                                                      CONCAT424(0x7f800000,
                                                                CONCAT420(0x7f800000,
                                                                          CONCAT416(0x7f800000,
                                                                                    CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                      }
LAB_00547653:
                      if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar95 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar95 >> 0x7f,0) == '\0') &&
                            (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar95 >> 0xbf,0) == '\0') &&
                          (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar95[0x1f]) {
                        auVar105 = ZEXT3264(local_2940);
                        break;
                      }
                      auVar108 = vsubps_avx(_local_2c00,local_2d40);
                      auVar109 = vsubps_avx(_local_2b00,local_2860);
                      auVar172 = ZEXT3264(auVar109);
                      auVar197 = vsubps_avx(_local_2b20,local_2880);
                      auVar201 = ZEXT3264(auVar197);
                      auVar198 = vsubps_avx(_local_2c20,_local_2c00);
                      auVar100 = vsubps_avx(_local_2b80,_local_2b00);
                      auVar11 = vsubps_avx(_local_2ba0,_local_2b20);
                      auVar29._4_4_ = auVar11._4_4_ * auVar109._4_4_;
                      auVar29._0_4_ = auVar11._0_4_ * auVar109._0_4_;
                      auVar29._8_4_ = auVar11._8_4_ * auVar109._8_4_;
                      auVar29._12_4_ = auVar11._12_4_ * auVar109._12_4_;
                      auVar29._16_4_ = auVar11._16_4_ * auVar109._16_4_;
                      auVar29._20_4_ = auVar11._20_4_ * auVar109._20_4_;
                      auVar29._24_4_ = auVar11._24_4_ * auVar109._24_4_;
                      auVar29._28_4_ = local_2ba0._28_4_;
                      auVar15 = vfmsub231ps_fma(auVar29,auVar100,auVar197);
                      auVar84 = ZEXT1632(auVar15);
                      auVar111 = ZEXT1632(auVar15);
                      auVar110 = ZEXT1632(auVar15);
                      auVar30._4_4_ = auVar197._4_4_ * auVar198._4_4_;
                      auVar30._0_4_ = auVar197._0_4_ * auVar198._0_4_;
                      auVar30._8_4_ = auVar197._8_4_ * auVar198._8_4_;
                      auVar30._12_4_ = auVar197._12_4_ * auVar198._12_4_;
                      auVar30._16_4_ = auVar197._16_4_ * auVar198._16_4_;
                      auVar30._20_4_ = auVar197._20_4_ * auVar198._20_4_;
                      auVar30._24_4_ = auVar197._24_4_ * auVar198._24_4_;
                      auVar30._28_4_ = local_2d40._28_4_;
                      auVar16 = vfmsub231ps_fma(auVar30,auVar11,auVar108);
                      auVar31._4_4_ = auVar100._4_4_ * auVar108._4_4_;
                      auVar31._0_4_ = auVar100._0_4_ * auVar108._0_4_;
                      auVar31._8_4_ = auVar100._8_4_ * auVar108._8_4_;
                      auVar31._12_4_ = auVar100._12_4_ * auVar108._12_4_;
                      auVar31._16_4_ = auVar100._16_4_ * auVar108._16_4_;
                      auVar31._20_4_ = auVar100._20_4_ * auVar108._20_4_;
                      auVar31._24_4_ = auVar100._24_4_ * auVar108._24_4_;
                      auVar31._28_4_ = auVar108._28_4_;
                      auVar17 = vfmsub231ps_fma(auVar31,auVar198,auVar109);
                      auVar114 = ZEXT1664(auVar17);
                      auVar12 = vsubps_avx(_local_2c00,*(undefined1 (*) [32])ray);
                      auVar131 = vsubps_avx(_local_2b00,*(undefined1 (*) [32])(ray + 0x20));
                      auVar157 = ZEXT3264(auVar131);
                      auVar102 = vsubps_avx(_local_2b20,*(undefined1 (*) [32])(ray + 0x40));
                      auVar195 = ZEXT3264(auVar102);
                      auVar104 = *(undefined1 (*) [32])(ray + 0x80);
                      auVar94 = *(undefined1 (*) [32])(ray + 0xa0);
                      auVar204._0_4_ = auVar104._0_4_ * auVar131._0_4_;
                      auVar204._4_4_ = auVar104._4_4_ * auVar131._4_4_;
                      auVar204._8_4_ = auVar104._8_4_ * auVar131._8_4_;
                      auVar204._12_4_ = auVar104._12_4_ * auVar131._12_4_;
                      auVar204._16_4_ = auVar104._16_4_ * auVar131._16_4_;
                      auVar204._20_4_ = auVar104._20_4_ * auVar131._20_4_;
                      auVar204._28_36_ = in_ZMM13._28_36_;
                      auVar204._24_4_ = auVar104._24_4_ * auVar131._24_4_;
                      auVar165 = vfmsub231ps_fma(auVar204._0_32_,auVar12,auVar94);
                      in_ZMM13 = ZEXT1664(auVar165);
                      auVar101 = *(undefined1 (*) [32])(ray + 0xc0);
                      auVar32._4_4_ = auVar101._4_4_ * auVar17._4_4_;
                      auVar32._0_4_ = auVar101._0_4_ * auVar17._0_4_;
                      auVar32._8_4_ = auVar101._8_4_ * auVar17._8_4_;
                      auVar32._12_4_ = auVar101._12_4_ * auVar17._12_4_;
                      auVar32._16_4_ = auVar101._16_4_ * 0.0;
                      auVar32._20_4_ = auVar101._20_4_ * 0.0;
                      auVar32._24_4_ = auVar101._24_4_ * 0.0;
                      auVar32._28_4_ = local_2b20._28_4_;
                      auVar97 = ZEXT1632(auVar16);
                      auVar93 = vfmadd231ps_fma(auVar32,auVar97,auVar94);
                      auVar33._4_4_ = auVar94._4_4_ * auVar102._4_4_;
                      auVar33._0_4_ = auVar94._0_4_ * auVar102._0_4_;
                      auVar33._8_4_ = auVar94._8_4_ * auVar102._8_4_;
                      auVar33._12_4_ = auVar94._12_4_ * auVar102._12_4_;
                      auVar33._16_4_ = auVar94._16_4_ * auVar102._16_4_;
                      auVar33._20_4_ = auVar94._20_4_ * auVar102._20_4_;
                      auVar33._24_4_ = auVar94._24_4_ * auVar102._24_4_;
                      auVar33._28_4_ = auVar94._28_4_;
                      auVar148 = vfmsub231ps_fma(auVar33,auVar131,auVar101);
                      in_ZMM14 = ZEXT1664(auVar148);
                      auVar34._4_4_ = auVar101._4_4_ * auVar12._4_4_;
                      auVar34._0_4_ = auVar101._0_4_ * auVar12._0_4_;
                      auVar34._8_4_ = auVar101._8_4_ * auVar12._8_4_;
                      auVar34._12_4_ = auVar101._12_4_ * auVar12._12_4_;
                      auVar34._16_4_ = auVar101._16_4_ * auVar12._16_4_;
                      auVar34._20_4_ = auVar101._20_4_ * auVar12._20_4_;
                      auVar34._24_4_ = auVar101._24_4_ * auVar12._24_4_;
                      auVar34._28_4_ = auVar101._28_4_;
                      auVar149 = vfmsub231ps_fma(auVar34,auVar102,auVar104);
                      auVar81 = ZEXT1632(auVar15);
                      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar81,auVar104);
                      auVar186 = ZEXT1664(auVar93);
                      auVar35._4_4_ = auVar11._4_4_ * auVar165._4_4_;
                      auVar35._0_4_ = auVar11._0_4_ * auVar165._0_4_;
                      auVar35._8_4_ = auVar11._8_4_ * auVar165._8_4_;
                      auVar35._12_4_ = auVar11._12_4_ * auVar165._12_4_;
                      auVar35._16_4_ = auVar11._16_4_ * 0.0;
                      auVar35._20_4_ = auVar11._20_4_ * 0.0;
                      auVar35._24_4_ = auVar11._24_4_ * 0.0;
                      auVar35._28_4_ = auVar104._28_4_;
                      auVar68 = vfmadd231ps_fma(auVar35,ZEXT1632(auVar149),auVar100);
                      auVar104 = vandps_avx(ZEXT1632(auVar93),local_28a0);
                      auVar204 = ZEXT3264(auVar104);
                      auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),ZEXT1632(auVar148),auVar198);
                      uVar202 = auVar104._0_4_;
                      auVar132._0_4_ = (float)(uVar202 ^ auVar68._0_4_);
                      uVar58 = auVar104._4_4_;
                      auVar132._4_4_ = (float)(uVar58 ^ auVar68._4_4_);
                      uVar205 = auVar104._8_4_;
                      auVar132._8_4_ = (float)(uVar205 ^ auVar68._8_4_);
                      uVar206 = auVar104._12_4_;
                      auVar132._12_4_ = (float)(uVar206 ^ auVar68._12_4_);
                      fVar207 = auVar104._16_4_;
                      auVar132._16_4_ = fVar207;
                      fVar67 = auVar104._20_4_;
                      auVar132._20_4_ = fVar67;
                      fVar208 = auVar104._24_4_;
                      auVar132._24_4_ = fVar208;
                      uVar65 = auVar104._28_4_;
                      auVar132._28_4_ = uVar65;
                      auVar133 = ZEXT3264(auVar132);
                      auVar74 = ZEXT3264(auVar95);
                      auVar94 = vcmpps_avx(auVar132,_DAT_01faff00,5);
                      in_ZMM12 = ZEXT3264(auVar94);
                      auVar101 = auVar95 & auVar94;
                      bVar66 = true;
                      local_2d20._0_32_ = auVar95;
                      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar101 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar101 >> 0x7f,0) == '\0') &&
                            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar101 >> 0xbf,0) == '\0') &&
                          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar101[0x1f]) {
                        auVar229 = ZEXT3264(CONCAT428(0x7f800000,
                                                      CONCAT424(0x7f800000,
                                                                CONCAT420(0x7f800000,
                                                                          CONCAT416(0x7f800000,
                                                                                    CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                      }
                      else {
                        _local_2ba0 = ZEXT1632(auVar17);
                        _local_2b80 = auVar97;
                        auVar100 = _local_2b80;
                        _local_2c20 = auVar81;
                        auVar198 = _local_2c20;
                        auVar94 = vandps_avx(auVar94,auVar95);
                        in_ZMM12 = ZEXT3264(auVar94);
                        auVar37._4_4_ = auVar197._4_4_ * auVar165._4_4_;
                        auVar37._0_4_ = auVar197._0_4_ * auVar165._0_4_;
                        auVar37._8_4_ = auVar197._8_4_ * auVar165._8_4_;
                        auVar37._12_4_ = auVar197._12_4_ * auVar165._12_4_;
                        auVar37._16_4_ = auVar197._16_4_ * 0.0;
                        auVar37._20_4_ = auVar197._20_4_ * 0.0;
                        auVar37._24_4_ = auVar197._24_4_ * 0.0;
                        auVar37._28_4_ = auVar95._28_4_;
                        auVar68 = vfmadd213ps_fma(auVar109,ZEXT1632(auVar149),auVar37);
                        auVar68 = vfmadd213ps_fma(auVar108,ZEXT1632(auVar148),ZEXT1632(auVar68));
                        auVar171._0_4_ = (float)(uVar202 ^ auVar68._0_4_);
                        auVar171._4_4_ = (float)(uVar58 ^ auVar68._4_4_);
                        auVar171._8_4_ = (float)(uVar205 ^ auVar68._8_4_);
                        auVar171._12_4_ = (float)(uVar206 ^ auVar68._12_4_);
                        auVar171._16_4_ = fVar207;
                        auVar171._20_4_ = fVar67;
                        auVar171._24_4_ = fVar208;
                        auVar171._28_4_ = uVar65;
                        auVar172 = ZEXT3264(auVar171);
                        auVar101 = vcmpps_avx(auVar171,_DAT_01faff00,5);
                        auVar109 = auVar94 & auVar101;
                        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar109 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar109 >> 0x7f,0) != '\0')
                              || (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar109 >> 0xbf,0) != '\0') ||
                            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar109[0x1f] < '\0') {
                          auVar109 = vandps_avx(ZEXT1632(auVar93),
                                                (undefined1  [32])local_2a00.field_0.z.field_0);
                          auVar114 = ZEXT3264(auVar109);
                          auVar101 = vandps_avx(auVar101,auVar94);
                          auVar197 = vsubps_avx(auVar109,auVar132);
                          auVar94 = vcmpps_avx(auVar197,auVar171,5);
                          in_ZMM12 = ZEXT3264(auVar94);
                          auVar11 = auVar101 & auVar94;
                          if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar11 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar11 >> 0x7f,0) != '\0') ||
                                (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar11 >> 0xbf,0) != '\0') ||
                              (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                              auVar11[0x1f] < '\0') {
                            local_2c60._0_8_ = tray_00;
                            auVar101 = vandps_avx(auVar94,auVar101);
                            auVar201 = ZEXT3264(auVar101);
                            auVar41._4_4_ = auVar102._4_4_ * auVar17._4_4_;
                            auVar41._0_4_ = auVar102._0_4_ * auVar17._0_4_;
                            auVar41._8_4_ = auVar102._8_4_ * auVar17._8_4_;
                            auVar41._12_4_ = auVar102._12_4_ * auVar17._12_4_;
                            auVar41._16_4_ = auVar102._16_4_ * 0.0;
                            auVar41._20_4_ = auVar102._20_4_ * 0.0;
                            auVar41._24_4_ = auVar102._24_4_ * 0.0;
                            auVar41._28_4_ = auVar197._28_4_;
                            auVar68 = vfmadd132ps_fma(auVar131,auVar41,auVar97);
                            auVar68 = vfmadd132ps_fma(auVar12,ZEXT1632(auVar68),auVar81);
                            auVar149._0_4_ = (float)(uVar202 ^ auVar68._0_4_);
                            auVar149._4_4_ = (float)(uVar58 ^ auVar68._4_4_);
                            auVar149._8_4_ = (float)(uVar205 ^ auVar68._8_4_);
                            auVar149._12_4_ = (float)(uVar206 ^ auVar68._12_4_);
                            auVar156._16_4_ = fVar207;
                            auVar156._0_16_ = auVar149;
                            auVar156._20_4_ = fVar67;
                            auVar156._24_4_ = fVar208;
                            auVar156._28_4_ = uVar65;
                            auVar157 = ZEXT3264(auVar156);
                            auVar42._4_4_ = auVar109._4_4_ * *(float *)(ray + 100);
                            auVar42._0_4_ = auVar109._0_4_ * *(float *)(ray + 0x60);
                            auVar42._8_4_ = auVar109._8_4_ * *(float *)(ray + 0x68);
                            auVar42._12_4_ = auVar109._12_4_ * *(float *)(ray + 0x6c);
                            auVar42._16_4_ = auVar109._16_4_ * *(float *)(ray + 0x70);
                            auVar42._20_4_ = auVar109._20_4_ * *(float *)(ray + 0x74);
                            auVar42._24_4_ = auVar109._24_4_ * *(float *)(ray + 0x78);
                            auVar42._28_4_ = auVar197._28_4_;
                            auVar197 = vcmpps_avx(auVar42,auVar156,1);
                            _local_2c00 = *(undefined1 (*) [32])(ray + 0x100);
                            auVar43._4_4_ = auVar109._4_4_ * *(float *)(ray + 0x104);
                            auVar43._0_4_ = auVar109._0_4_ * *(float *)(ray + 0x100);
                            auVar43._8_4_ = auVar109._8_4_ * *(float *)(ray + 0x108);
                            auVar43._12_4_ = auVar109._12_4_ * *(float *)(ray + 0x10c);
                            auVar43._16_4_ = auVar109._16_4_ * *(float *)(ray + 0x110);
                            auVar43._20_4_ = auVar109._20_4_ * *(float *)(ray + 0x114);
                            auVar43._24_4_ = auVar109._24_4_ * *(float *)(ray + 0x118);
                            auVar43._28_4_ = *(undefined4 *)(ray + 0x11c);
                            auVar11 = vcmpps_avx(auVar156,auVar43,2);
                            auVar197 = vandps_avx(auVar11,auVar197);
                            auVar11 = auVar101 & auVar197;
                            auVar110 = auVar111;
                            if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar11 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar11 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar11 >> 0x7f,0) != '\0') ||
                                  (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                                  ) || SUB321(auVar11 >> 0xbf,0) != '\0') ||
                                (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar11[0x1f] < '\0') {
                              auVar197 = vandps_avx(auVar101,auVar197);
                              auVar11 = vcmpps_avx(ZEXT1632(auVar93),_DAT_01faff00,4);
                              auVar186 = ZEXT3264(auVar11);
                              auVar12 = auVar197 & auVar11;
                              if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar12 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar12 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar12 >> 0x7f,0) != '\0')
                                    || (auVar12 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar12 >> 0xbf,0) != '\0')
                                  || (auVar12 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar12[0x1f] < '\0') {
                                auVar197 = vandps_avx(auVar11,auVar197);
                                uVar58 = *(uint *)(lVar59 + 0x40 + uVar57 * 4);
                                local_2d40._0_8_ = (context->scene->geometries).items[uVar58].ptr;
                                local_2d40._8_24_ = auVar108._8_24_;
                                uVar202 = ((Geometry *)local_2d40._0_8_)->mask;
                                auVar73._4_4_ = uVar202;
                                auVar73._0_4_ = uVar202;
                                auVar73._8_4_ = uVar202;
                                auVar73._12_4_ = uVar202;
                                auVar73._16_4_ = uVar202;
                                auVar73._20_4_ = uVar202;
                                auVar73._24_4_ = uVar202;
                                auVar73._28_4_ = uVar202;
                                auVar108 = vpand_avx2(auVar73,*(undefined1 (*) [32])(ray + 0x120));
                                auVar11 = vpcmpeqd_avx2(auVar108,_DAT_01faff00);
                                auVar186 = ZEXT3264(auVar11);
                                auVar108 = auVar197 & ~auVar11;
                                if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar108 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar108 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar108 >> 0x7f,0) != '\0'
                                       ) || (auVar108 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                     SUB321(auVar108 >> 0xbf,0) != '\0') ||
                                    (auVar108 & (undefined1  [32])0x100000000) !=
                                    (undefined1  [32])0x0) || auVar108[0x1f] < '\0') {
                                  uVar6 = *(undefined4 *)(lVar59 + 0x50 + uVar57 * 4);
                                  auVar95 = vandnps_avx(auVar11,auVar197);
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (((Geometry *)local_2d40._0_8_)->occlusionFilterN !=
                                      (RTCFilterFunctionN)0x0)) {
                                    auVar108 = vrcpps_avx(auVar109);
                                    auVar185._8_4_ = 0x3f800000;
                                    auVar185._0_8_ = 0x3f8000003f800000;
                                    auVar185._12_4_ = 0x3f800000;
                                    auVar185._16_4_ = 0x3f800000;
                                    auVar185._20_4_ = 0x3f800000;
                                    auVar185._24_4_ = 0x3f800000;
                                    auVar185._28_4_ = 0x3f800000;
                                    auVar93 = vfnmadd213ps_fma(auVar109,auVar108,auVar185);
                                    auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar108,auVar108);
                                    auVar114 = ZEXT1664(auVar93);
                                    fVar107 = auVar93._0_4_;
                                    fVar116 = auVar93._4_4_;
                                    auVar46._4_4_ = fVar116 * auVar132._4_4_;
                                    auVar46._0_4_ = fVar107 * auVar132._0_4_;
                                    fVar118 = auVar93._8_4_;
                                    auVar46._8_4_ = fVar118 * auVar132._8_4_;
                                    fVar120 = auVar93._12_4_;
                                    auVar46._12_4_ = fVar120 * auVar132._12_4_;
                                    auVar46._16_4_ = fVar207 * 0.0;
                                    auVar46._20_4_ = fVar67 * 0.0;
                                    auVar46._24_4_ = fVar208 * 0.0;
                                    auVar46._28_4_ = auVar108._28_4_;
                                    auVar108 = vminps_avx(auVar46,auVar185);
                                    auVar47._4_4_ = fVar116 * auVar171._4_4_;
                                    auVar47._0_4_ = fVar107 * auVar171._0_4_;
                                    auVar47._8_4_ = fVar118 * auVar171._8_4_;
                                    auVar47._12_4_ = fVar120 * auVar171._12_4_;
                                    auVar47._16_4_ = fVar207 * 0.0;
                                    auVar47._20_4_ = fVar67 * 0.0;
                                    auVar47._24_4_ = fVar208 * 0.0;
                                    auVar47._28_4_ = uVar65;
                                    auVar109 = vminps_avx(auVar47,auVar185);
                                    auVar197 = vsubps_avx(auVar185,auVar108);
                                    auVar11 = vsubps_avx(auVar185,auVar109);
                                    auVar53._8_8_ = uStack_28f8;
                                    auVar53._0_8_ = local_2900;
                                    auVar52._16_8_ = uStack_28f0;
                                    auVar52._0_16_ = auVar53;
                                    auVar52._24_8_ = uStack_28e8;
                                    auVar195 = ZEXT3264(auVar52);
                                    local_2a80 = vblendvps_avx(auVar108,auVar197,auVar52);
                                    local_2a60 = vblendvps_avx(auVar109,auVar11,auVar52);
                                    auVar133 = ZEXT3264(local_2a60);
                                    pRVar9 = context->user;
                                    auVar166._4_4_ = uVar58;
                                    auVar166._0_4_ = uVar58;
                                    auVar166._8_4_ = uVar58;
                                    auVar166._12_4_ = uVar58;
                                    local_2a20._16_4_ = uVar58;
                                    local_2a20._0_16_ = auVar166;
                                    local_2a20._20_4_ = uVar58;
                                    local_2a20._24_4_ = uVar58;
                                    local_2a20._28_4_ = uVar58;
                                    auVar172 = ZEXT3264(local_2a20);
                                    auVar180._4_4_ = uVar6;
                                    auVar180._0_4_ = uVar6;
                                    auVar180._8_4_ = uVar6;
                                    auVar180._12_4_ = uVar6;
                                    local_2a40._16_4_ = uVar6;
                                    local_2a40._0_16_ = auVar180;
                                    local_2a40._20_4_ = uVar6;
                                    local_2a40._24_4_ = uVar6;
                                    local_2a40._28_4_ = uVar6;
                                    auVar186 = ZEXT3264(local_2a40);
                                    local_2c20 = auVar15._0_8_;
                                    uStack_2c18 = auVar15._8_8_;
                                    local_2ae0 = local_2c20;
                                    uStack_2ad8 = uStack_2c18;
                                    uStack_2ad0 = 0;
                                    uStack_2ac8 = 0;
                                    local_2b80 = auVar16._0_8_;
                                    uStack_2b78 = auVar16._8_8_;
                                    local_2ac0 = local_2b80;
                                    uStack_2ab8 = uStack_2b78;
                                    uStack_2ab0 = 0;
                                    uStack_2aa8 = 0;
                                    _local_2aa0 = ZEXT1632(auVar17);
                                    aVar13 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                             vpcmpeqd_avx2(local_2a80,local_2a80);
                                    local_2c28->components[1].field_0 = aVar13;
                                    (((Vec3vf<8> *)&(local_2c28->field_0).x)->field_0).field_0.x.
                                    field_0 = aVar13;
                                    local_2a00._0_4_ = pRVar9->instID[0];
                                    local_2a00._4_4_ = local_2a00._0_4_;
                                    local_2a00._8_4_ = local_2a00._0_4_;
                                    local_2a00._12_4_ = local_2a00._0_4_;
                                    local_2a00._16_4_ = local_2a00._0_4_;
                                    local_2a00._20_4_ = local_2a00._0_4_;
                                    local_2a00._24_4_ = local_2a00._0_4_;
                                    local_2a00._28_4_ = local_2a00._0_4_;
                                    local_2a00._32_4_ = pRVar9->instPrimID[0];
                                    auVar84._4_4_ = fVar116 * auVar149._4_4_;
                                    auVar84._0_4_ = fVar107 * auVar149._0_4_;
                                    auVar84._8_4_ = fVar118 * auVar149._8_4_;
                                    auVar84._12_4_ = fVar120 * auVar149._12_4_;
                                    auVar84._16_4_ = fVar207 * 0.0;
                                    auVar84._20_4_ = fVar67 * 0.0;
                                    auVar84._24_4_ = fVar208 * 0.0;
                                    auVar84._28_4_ = 0;
                                    local_2a00._36_4_ = local_2a00._32_4_;
                                    local_2a00._40_4_ = local_2a00._32_4_;
                                    local_2a00._44_4_ = local_2a00._32_4_;
                                    local_2a00._48_4_ = local_2a00._32_4_;
                                    local_2a00._52_4_ = local_2a00._32_4_;
                                    local_2a00._56_4_ = local_2a00._32_4_;
                                    local_2a00._60_4_ = local_2a00._32_4_;
                                    auVar108 = vblendvps_avx(_local_2c00,auVar84,auVar95);
                                    *(undefined1 (*) [32])(ray + 0x100) = auVar108;
                                    local_2ce0 = auVar95;
                                    local_2cc0._0_4_ = SUB84(local_2ce0,0);
                                    local_2cc0._4_4_ = (undefined4)((ulong)local_2ce0 >> 0x20);
                                    local_2cc0._8_4_ =
                                         SUB84(((Geometry *)local_2d40._0_8_)->userPtr,0);
                                    local_2cc0._12_4_ =
                                         (undefined4)
                                         ((ulong)((Geometry *)local_2d40._0_8_)->userPtr >> 0x20);
                                    local_2cc0._16_4_ = SUB84(context->user,0);
                                    local_2cc0._20_4_ = (undefined4)((ulong)context->user >> 0x20);
                                    local_2ca0 = (RTCHitN *)&local_2ae0;
                                    fStack_2c98 = 1.12104e-44;
                                    _local_2c20 = auVar198;
                                    _local_2b80 = auVar100;
                                    local_2cc0._0_8_ = local_2ce0;
                                    local_2cc0._24_8_ = ray;
                                    if (((Geometry *)local_2d40._0_8_)->occlusionFilterN !=
                                        (RTCFilterFunctionN)0x0) {
                                      auVar114 = ZEXT1664(auVar93);
                                      auVar133 = ZEXT1664(local_2a60._0_16_);
                                      auVar157 = ZEXT1664(auVar149);
                                      auVar172 = ZEXT1664(auVar166);
                                      auVar186 = ZEXT1664(auVar180);
                                      auVar195 = ZEXT1664(auVar53);
                                      auVar201 = ZEXT1664(auVar101._0_16_);
                                      auVar204 = ZEXT1664(auVar104._0_16_);
                                      in_ZMM12 = ZEXT1664(auVar94._0_16_);
                                      in_ZMM13 = ZEXT1664(auVar165);
                                      in_ZMM14 = ZEXT1664(auVar148);
                                      (*((Geometry *)local_2d40._0_8_)->occlusionFilterN)
                                                ((RTCFilterFunctionNArguments *)local_2cc0);
                                      auVar74._8_56_ = extraout_var_00;
                                      auVar74._0_8_ = extraout_XMM1_Qa_00;
                                      auVar84 = auVar74._0_32_;
                                    }
                                    auVar95 = vpcmpeqd_avx2(local_2ce0,_DAT_01faff00);
                                    auVar104 = _DAT_01fe9960 & ~auVar95;
                                    if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0 &&
                                             (auVar104 >> 0x3f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar104 >> 0x5f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           SUB321(auVar104 >> 0x7f,0) == '\0') &&
                                          (auVar104 & (undefined1  [32])0x100000000) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar104 >> 0xbf,0) == '\0') &&
                                        (auVar104 & (undefined1  [32])0x100000000) ==
                                        (undefined1  [32])0x0) && -1 < auVar104[0x1f]) {
                                      auVar95 = auVar95 ^ _DAT_01fe9960;
                                    }
                                    else {
                                      p_Var10 = context->args->filter;
                                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          ((*(byte *)(local_2d40._0_8_ + 0x3e) & 0x40) != 0)))) {
                                        auVar114 = ZEXT1664(auVar114._0_16_);
                                        auVar133 = ZEXT1664(auVar133._0_16_);
                                        auVar157 = ZEXT1664(auVar157._0_16_);
                                        auVar172 = ZEXT1664(auVar172._0_16_);
                                        auVar186 = ZEXT1664(auVar186._0_16_);
                                        auVar195 = ZEXT1664(auVar195._0_16_);
                                        auVar201 = ZEXT1664(auVar201._0_16_);
                                        auVar204 = ZEXT1664(auVar204._0_16_);
                                        in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                        in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                        in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                        (*p_Var10)((RTCFilterFunctionNArguments *)local_2cc0);
                                      }
                                      auVar104 = vpcmpeqd_avx2(local_2ce0,_DAT_01faff00);
                                      auVar95 = auVar104 ^ _DAT_01fe9960;
                                      auVar84._8_4_ = 0xff800000;
                                      auVar84._0_8_ = 0xff800000ff800000;
                                      auVar84._12_4_ = 0xff800000;
                                      auVar84._16_4_ = 0xff800000;
                                      auVar84._20_4_ = 0xff800000;
                                      auVar84._24_4_ = 0xff800000;
                                      auVar84._28_4_ = 0xff800000;
                                      auVar104 = vblendvps_avx(auVar84,*(undefined1 (*) [32])
                                                                        (local_2cc0._24_8_ + 0x100),
                                                               auVar104);
                                      *(undefined1 (*) [32])(local_2cc0._24_8_ + 0x100) = auVar104;
                                    }
                                    auVar104 = vblendvps_avx(_local_2c00,
                                                             *(undefined1 (*) [32])local_2cf0,
                                                             auVar95);
                                    *(undefined1 (*) [32])local_2cf0 = auVar104;
                                  }
                                  auVar104 = local_2d20._0_32_ & ~auVar95;
                                  auVar95 = vandnps_avx(auVar95,local_2d20._0_32_);
                                  bVar66 = (((((((auVar104 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0 ||
                                                (auVar104 >> 0x3f & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar104 >> 0x5f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              SUB321(auVar104 >> 0x7f,0) != '\0') ||
                                             (auVar104 & (undefined1  [32])0x100000000) !=
                                             (undefined1  [32])0x0) ||
                                            SUB321(auVar104 >> 0xbf,0) != '\0') ||
                                           (auVar104 & (undefined1  [32])0x100000000) !=
                                           (undefined1  [32])0x0) || auVar104[0x1f] < '\0';
                                  auVar110 = auVar84;
                                }
                              }
                            }
                            auVar229 = ZEXT3264(CONCAT428(0x7f800000,
                                                          CONCAT424(0x7f800000,
                                                                    CONCAT420(0x7f800000,
                                                                              CONCAT416(0x7f800000,
                                                                                        CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                            auVar74 = ZEXT3264(auVar95);
                            tray_00 = (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1
                                       *)local_2c60._0_8_;
                            goto LAB_0054777b;
                          }
                        }
                        auVar229 = ZEXT3264(CONCAT428(0x7f800000,
                                                      CONCAT424(0x7f800000,
                                                                CONCAT420(0x7f800000,
                                                                          CONCAT416(0x7f800000,
                                                                                    CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                        auVar201 = ZEXT3264(auVar101);
                        auVar74 = ZEXT3264(auVar95);
                      }
LAB_0054777b:
                      auVar95 = auVar74._0_32_;
                      auVar104 = vpcmpeqd_avx2(auVar110,auVar110);
                      auVar86 = ZEXT3264(auVar104);
                      auVar105 = ZEXT3264(local_2940);
                      if ((!bVar66) ||
                         (unaff_R15 = uVar57 + 1, bVar66 = 2 < uVar57, uVar57 = unaff_R15, bVar66))
                      break;
                    }
                    auVar104 = auVar86._0_32_;
                    auVar94 = auVar105._0_32_;
                    auVar114 = ZEXT3264(auVar95);
                    auVar103 = vandps_avx(auVar95,local_2920);
                    auVar95 = local_2920 & auVar95;
                  } while (((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar95 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar95 >> 0x7f,0) != '\0') ||
                              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar95 >> 0xbf,0) != '\0') ||
                            (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar95[0x1f] < '\0') && (uVar57 = local_2bb8 + 1, uVar57 < local_2bc0))
                  ;
                  local_2b60._0_4_ = auVar103._0_4_ ^ auVar86._0_4_;
                  local_2b60._4_4_ = auVar103._4_4_ ^ auVar86._4_4_;
                  local_2b60._8_4_ = auVar103._8_4_ ^ auVar86._8_4_;
                  local_2b60._12_4_ = auVar103._12_4_ ^ auVar86._12_4_;
                  local_2b60._16_4_ = auVar103._16_4_ ^ auVar86._16_4_;
                  local_2b60._20_4_ = auVar103._20_4_ ^ auVar86._20_4_;
                  local_2b60._24_4_ = auVar103._24_4_ ^ auVar86._24_4_;
                  local_2b60._28_4_ = auVar103._28_4_ ^ auVar86._28_4_;
                }
                local_2b60 = vorps_avx(auVar94,local_2b60);
                auVar104 = auVar104 & ~local_2b60;
                if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar104 >> 0x7f,0) == '\0') &&
                      (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar104 >> 0xbf,0) == '\0') &&
                    (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar104[0x1f]) goto LAB_005485af;
                auVar99._8_4_ = 0xff800000;
                auVar99._0_8_ = 0xff800000ff800000;
                auVar99._12_4_ = 0xff800000;
                auVar99._16_4_ = 0xff800000;
                auVar99._20_4_ = 0xff800000;
                auVar99._24_4_ = 0xff800000;
                auVar99._28_4_ = 0xff800000;
                auVar104 = vblendvps_avx(local_2640,auVar99,local_2b60);
                auVar94 = vpcmpeqd_avx2(local_2640,local_2640);
                auVar86 = ZEXT3264(auVar94);
                local_2640 = auVar104;
              }
              goto LAB_00546fdd;
            }
            uVar56 = root.ptr & 0xfffffffffffffff0;
            tray_00 = (anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 *)0x0;
            auVar104 = vcmpps_avx(local_2640,auVar105._0_32_,6);
            auVar94 = auVar229._0_32_;
            do {
              uVar61 = *(ulong *)(uVar56 + 0x20 + lVar59 * 2);
              if (uVar61 == 8) {
                auVar105 = ZEXT3264(auVar94);
                break;
              }
              uVar65 = *(undefined4 *)(uVar56 + 0x90 + lVar59);
              auVar110._4_4_ = uVar65;
              auVar110._0_4_ = uVar65;
              auVar110._8_4_ = uVar65;
              auVar110._12_4_ = uVar65;
              auVar110._16_4_ = uVar65;
              auVar110._20_4_ = uVar65;
              auVar110._24_4_ = uVar65;
              auVar110._28_4_ = uVar65;
              uVar65 = *(undefined4 *)(uVar56 + 0x30 + lVar59);
              auVar102._4_4_ = uVar65;
              auVar102._0_4_ = uVar65;
              auVar102._8_4_ = uVar65;
              auVar102._12_4_ = uVar65;
              auVar102._16_4_ = uVar65;
              auVar102._20_4_ = uVar65;
              auVar102._24_4_ = uVar65;
              auVar102._28_4_ = uVar65;
              auVar95 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar65 = *(undefined4 *)(uVar56 + 0xb0 + lVar59);
              auVar81._4_4_ = uVar65;
              auVar81._0_4_ = uVar65;
              auVar81._8_4_ = uVar65;
              auVar81._12_4_ = uVar65;
              auVar81._16_4_ = uVar65;
              auVar81._20_4_ = uVar65;
              auVar81._24_4_ = uVar65;
              auVar81._28_4_ = uVar65;
              auVar93 = vfmadd231ps_fma(auVar102,auVar95,auVar110);
              uVar65 = *(undefined4 *)(uVar56 + 0x50 + lVar59);
              auVar111._4_4_ = uVar65;
              auVar111._0_4_ = uVar65;
              auVar111._8_4_ = uVar65;
              auVar111._12_4_ = uVar65;
              auVar111._16_4_ = uVar65;
              auVar111._20_4_ = uVar65;
              auVar111._24_4_ = uVar65;
              auVar111._28_4_ = uVar65;
              auVar68 = vfmadd231ps_fma(auVar111,auVar95,auVar81);
              uVar65 = *(undefined4 *)(uVar56 + 0xd0 + lVar59);
              auVar150._4_4_ = uVar65;
              auVar150._0_4_ = uVar65;
              auVar150._8_4_ = uVar65;
              auVar150._12_4_ = uVar65;
              auVar150._16_4_ = uVar65;
              auVar150._20_4_ = uVar65;
              auVar150._24_4_ = uVar65;
              auVar150._28_4_ = uVar65;
              uVar65 = *(undefined4 *)(uVar56 + 0x70 + lVar59);
              auVar97._4_4_ = uVar65;
              auVar97._0_4_ = uVar65;
              auVar97._8_4_ = uVar65;
              auVar97._12_4_ = uVar65;
              auVar97._16_4_ = uVar65;
              auVar97._20_4_ = uVar65;
              auVar97._24_4_ = uVar65;
              auVar97._28_4_ = uVar65;
              uVar65 = *(undefined4 *)(uVar56 + 0xa0 + lVar59);
              auVar181._4_4_ = uVar65;
              auVar181._0_4_ = uVar65;
              auVar181._8_4_ = uVar65;
              auVar181._12_4_ = uVar65;
              auVar181._16_4_ = uVar65;
              auVar181._20_4_ = uVar65;
              auVar181._24_4_ = uVar65;
              auVar181._28_4_ = uVar65;
              uVar65 = *(undefined4 *)(uVar56 + 0x40 + lVar59);
              auVar167._4_4_ = uVar65;
              auVar167._0_4_ = uVar65;
              auVar167._8_4_ = uVar65;
              auVar167._12_4_ = uVar65;
              auVar167._16_4_ = uVar65;
              auVar167._20_4_ = uVar65;
              auVar167._24_4_ = uVar65;
              auVar167._28_4_ = uVar65;
              auVar15 = vfmadd231ps_fma(auVar97,auVar95,auVar150);
              auVar16 = vfmadd231ps_fma(auVar167,auVar95,auVar181);
              uVar65 = *(undefined4 *)(uVar56 + 0xc0 + lVar59);
              auVar151._4_4_ = uVar65;
              auVar151._0_4_ = uVar65;
              auVar151._8_4_ = uVar65;
              auVar151._12_4_ = uVar65;
              auVar151._16_4_ = uVar65;
              auVar151._20_4_ = uVar65;
              auVar151._24_4_ = uVar65;
              auVar151._28_4_ = uVar65;
              uVar65 = *(undefined4 *)(uVar56 + 0x60 + lVar59);
              auVar182._4_4_ = uVar65;
              auVar182._0_4_ = uVar65;
              auVar182._8_4_ = uVar65;
              auVar182._12_4_ = uVar65;
              auVar182._16_4_ = uVar65;
              auVar182._20_4_ = uVar65;
              auVar182._24_4_ = uVar65;
              auVar182._28_4_ = uVar65;
              uVar65 = *(undefined4 *)(uVar56 + 0xe0 + lVar59);
              auVar194._4_4_ = uVar65;
              auVar194._0_4_ = uVar65;
              auVar194._8_4_ = uVar65;
              auVar194._12_4_ = uVar65;
              auVar194._16_4_ = uVar65;
              auVar194._20_4_ = uVar65;
              auVar194._24_4_ = uVar65;
              auVar194._28_4_ = uVar65;
              auVar17 = vfmadd231ps_fma(auVar182,auVar95,auVar151);
              uVar65 = *(undefined4 *)(uVar56 + 0x80 + lVar59);
              auVar199._4_4_ = uVar65;
              auVar199._0_4_ = uVar65;
              auVar199._8_4_ = uVar65;
              auVar199._12_4_ = uVar65;
              auVar199._16_4_ = uVar65;
              auVar199._20_4_ = uVar65;
              auVar199._24_4_ = uVar65;
              auVar199._28_4_ = uVar65;
              auVar165 = vfmadd231ps_fma(auVar199,auVar95,auVar194);
              auVar204 = ZEXT3264(local_2740);
              auVar11._4_4_ = fStack_271c;
              auVar11._0_4_ = local_2720;
              auVar11._8_4_ = fStack_2718;
              auVar11._12_4_ = fStack_2714;
              auVar11._16_4_ = fStack_2710;
              auVar11._20_4_ = fStack_270c;
              auVar11._24_4_ = fStack_2708;
              auVar11._28_4_ = uStack_2704;
              in_ZMM12 = ZEXT3264(auVar11);
              auVar93 = vfmsub213ps_fma(ZEXT1632(auVar93),local_2780,auVar11);
              auVar12._4_4_ = fStack_26fc;
              auVar12._0_4_ = local_2700;
              auVar12._8_4_ = fStack_26f8;
              auVar12._12_4_ = fStack_26f4;
              auVar12._16_4_ = fStack_26f0;
              auVar12._20_4_ = fStack_26ec;
              auVar12._24_4_ = fStack_26e8;
              auVar12._28_4_ = uStack_26e4;
              in_ZMM13 = ZEXT3264(auVar12);
              auVar68 = vfmsub213ps_fma(ZEXT1632(auVar68),local_2760,auVar12);
              auVar131._4_4_ = fStack_26dc;
              auVar131._0_4_ = local_26e0;
              auVar131._8_4_ = fStack_26d8;
              auVar131._12_4_ = fStack_26d4;
              auVar131._16_4_ = fStack_26d0;
              auVar131._20_4_ = fStack_26cc;
              auVar131._24_4_ = fStack_26c8;
              auVar131._28_4_ = uStack_26c4;
              in_ZMM14 = ZEXT3264(auVar131);
              auVar15 = vfmsub213ps_fma(ZEXT1632(auVar15),local_2740,auVar131);
              auVar133 = ZEXT1664(auVar15);
              auVar16 = vfmsub213ps_fma(ZEXT1632(auVar16),local_2780,auVar11);
              auVar172 = ZEXT1664(auVar16);
              auVar17 = vfmsub213ps_fma(ZEXT1632(auVar17),local_2760,auVar12);
              auVar186 = ZEXT1664(auVar17);
              auVar165 = vfmsub213ps_fma(ZEXT1632(auVar165),local_2740,auVar131);
              auVar201 = ZEXT1664(auVar165);
              auVar101 = vpminsd_avx2(ZEXT1632(auVar93),ZEXT1632(auVar16));
              auVar108 = vpminsd_avx2(ZEXT1632(auVar68),ZEXT1632(auVar17));
              auVar101 = vpmaxsd_avx2(auVar101,auVar108);
              auVar108 = vpminsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar165));
              auVar195 = ZEXT3264(auVar108);
              auVar109 = vpmaxsd_avx2(auVar101,auVar108);
              auVar157 = ZEXT3264(auVar109);
              auVar101 = vpmaxsd_avx2(ZEXT1632(auVar93),ZEXT1632(auVar16));
              auVar108 = vpmaxsd_avx2(ZEXT1632(auVar68),ZEXT1632(auVar17));
              auVar108 = vpminsd_avx2(auVar101,auVar108);
              auVar101 = vpmaxsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar165));
              auVar101 = vpminsd_avx2(auVar108,auVar101);
              auVar108 = vpmaxsd_avx2(auVar109,local_2660);
              auVar101 = vpminsd_avx2(auVar101,local_2640);
              auVar101 = vcmpps_avx(auVar108,auVar101,2);
              if (((uint)root.ptr & 7) == 6) {
                uVar65 = *(undefined4 *)(uVar56 + 0xf0 + lVar59);
                auVar112._4_4_ = uVar65;
                auVar112._0_4_ = uVar65;
                auVar112._8_4_ = uVar65;
                auVar112._12_4_ = uVar65;
                auVar112._16_4_ = uVar65;
                auVar112._20_4_ = uVar65;
                auVar112._24_4_ = uVar65;
                auVar112._28_4_ = uVar65;
                auVar108 = vcmpps_avx(auVar112,auVar95,2);
                uVar65 = *(undefined4 *)(uVar56 + 0x100 + lVar59);
                auVar126._4_4_ = uVar65;
                auVar126._0_4_ = uVar65;
                auVar126._8_4_ = uVar65;
                auVar126._12_4_ = uVar65;
                auVar126._16_4_ = uVar65;
                auVar126._20_4_ = uVar65;
                auVar126._24_4_ = uVar65;
                auVar126._28_4_ = uVar65;
                auVar133 = ZEXT3264(auVar126);
                auVar95 = vcmpps_avx(auVar95,auVar126,1);
                auVar95 = vandps_avx(auVar108,auVar95);
                auVar95 = vandps_avx(auVar95,auVar101);
                auVar93 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
              }
              else {
                auVar93 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
              }
              auVar114 = ZEXT3264(auVar108);
              auVar68 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
              auVar93 = vpand_avx(auVar93,auVar68);
              auVar95 = vpmovzxwd_avx2(auVar93);
              auVar95 = vpslld_avx2(auVar95,0x1f);
              if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar95 >> 0x7f,0) == '\0') &&
                    (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar95 >> 0xbf,0) == '\0') &&
                  (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar95[0x1f]) {
                auVar105 = ZEXT3264(auVar94);
                uVar61 = uVar57;
              }
              else {
                auVar95 = vblendvps_avx(auVar229._0_32_,auVar109,auVar95);
                auVar105 = ZEXT3264(auVar95);
                if (uVar57 != 8) {
                  *puVar64 = uVar57;
                  puVar64 = puVar64 + 1;
                  *pauVar60 = auVar94;
                  pauVar60 = pauVar60 + 1;
                }
              }
              uVar57 = uVar61;
              auVar94 = auVar105._0_32_;
              lVar59 = lVar59 + 4;
            } while (lVar59 != 0);
            if (uVar57 == 8) {
              iVar55 = 4;
              auVar104 = vpcmpeqd_avx2(auVar94,auVar94);
              auVar86 = ZEXT3264(auVar104);
              goto LAB_005484c9;
            }
            auVar104 = vcmpps_avx(local_2640,auVar105._0_32_,6);
            uVar65 = vmovmskps_avx(auVar104);
            auVar104 = vpcmpeqd_avx2(auVar94,auVar94);
            auVar86 = ZEXT3264(auVar104);
            root.ptr = uVar57;
          } while ((byte)uVar62 < (byte)POPCOUNT(uVar65));
          *puVar64 = uVar57;
          puVar64 = puVar64 + 1;
          *pauVar60 = auVar105._0_32_;
          pauVar60 = pauVar60 + 1;
          iVar55 = 4;
        }
        else {
          local_2c20 = (undefined1  [8])CONCAT44(0,POPCOUNT(uVar65));
          while (unaff_R15 != 0) {
            k = 0;
            for (uVar57 = unaff_R15; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            local_2d20._0_8_ = k;
            tray_00 = &local_2840;
            auVar104 = ZEXT1632(auVar86._0_16_);
            auVar114 = ZEXT1664(auVar114._0_16_);
            auVar133 = ZEXT1664(auVar133._0_16_);
            auVar157 = ZEXT1664(auVar157._0_16_);
            auVar172 = ZEXT1664(auVar172._0_16_);
            auVar186 = ZEXT1664(auVar186._0_16_);
            auVar195 = ZEXT1664(auVar195._0_16_);
            auVar201 = ZEXT1664(auVar201._0_16_);
            auVar204 = ZEXT1664(auVar204._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            bVar66 = occluded1(local_2bc8,local_2bd0,root,k,&local_2d51,ray,
                               (TravRayK<8,_false> *)&tray_00->field_0,context);
            if (bVar66) {
              *(undefined4 *)(local_2b60 + local_2d20._0_8_ * 4) = 0xffffffff;
            }
            unaff_R15 = unaff_R15 - 1 & unaff_R15;
            auVar229 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar104 = vpcmpeqd_avx2(auVar104,auVar104);
            auVar86 = ZEXT3264(auVar104);
            auVar105 = ZEXT3264(local_2d40);
          }
          auVar104 = auVar86._0_32_ & ~local_2b60;
          iVar55 = 3;
          if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar104 >> 0x7f,0) != '\0') ||
                (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0xbf,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar104[0x1f] < '\0') {
            auVar100._8_4_ = 0xff800000;
            auVar100._0_8_ = 0xff800000ff800000;
            auVar100._12_4_ = 0xff800000;
            auVar100._16_4_ = 0xff800000;
            auVar100._20_4_ = 0xff800000;
            auVar100._24_4_ = 0xff800000;
            auVar100._28_4_ = 0xff800000;
            auVar104 = vblendvps_avx(local_2640,auVar100,local_2b60);
            auVar94 = vpcmpeqd_avx2(local_2640,local_2640);
            auVar86 = ZEXT3264(auVar94);
            local_2640 = auVar104;
            iVar55 = 2;
          }
          unaff_R15 = 0;
          if ((uint)uVar62 < (uint)local_2c20._0_4_) goto LAB_0054701b;
        }
LAB_005484c9:
      } while (iVar55 != 3);
LAB_005485af:
      auVar104 = vandps_avx(local_28c0,local_2b60);
      auVar85._8_4_ = 0xff800000;
      auVar85._0_8_ = 0xff800000ff800000;
      auVar85._12_4_ = 0xff800000;
      auVar85._16_4_ = 0xff800000;
      auVar85._20_4_ = 0xff800000;
      auVar85._24_4_ = 0xff800000;
      auVar85._28_4_ = 0xff800000;
      auVar104 = vmaskmovps_avx(auVar104,auVar85);
      *(undefined1 (*) [32])local_2cf0 = auVar104;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }